

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-sp3.c
# Opt level: O3

int read_file(coda_product *product)

{
  undefined4 uVar1;
  char cVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined8 field_type;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  undefined1 uVar10;
  undefined1 uVar11;
  undefined7 uVar12;
  char cVar13;
  undefined3 uVar14;
  undefined3 uVar15;
  undefined1 uVar16;
  undefined2 uVar17;
  uint uVar18;
  int iVar19;
  FILE *__stream;
  long lVar20;
  coda_mem_data *pcVar21;
  coda_type_record *pcVar22;
  coda_type_record_field *pcVar23;
  coda_mem_array *pcVar24;
  size_t sVar25;
  coda_mem_special *pcVar26;
  coda_type_array *pcVar27;
  coda_mem_record *pcVar28;
  char *pcVar29;
  undefined1 field_type_00 [8];
  char *message;
  long lVar30;
  undefined8 *puVar31;
  long in_FS_OFFSET;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  double double_value;
  int64_t int_value;
  char line [1000];
  undefined8 uStack_5f0;
  char local_5e8;
  char cStack_5e7;
  char cStack_5e6;
  char cStack_5e5;
  char cStack_5e4;
  char cStack_5e3;
  undefined1 uStack_5e2;
  undefined1 uStack_5e1;
  undefined7 uStack_5e0;
  char cStack_5d9;
  uint5 local_5d8;
  undefined3 uStack_5d3;
  undefined3 uStack_5d0;
  undefined5 uStack_5cd;
  undefined3 uStack_5c8;
  undefined5 uStack_5c5;
  undefined1 uStack_5c0;
  undefined2 uStack_5bf;
  undefined1 uStack_5bd;
  undefined4 uStack_5b8;
  undefined8 uStack_5b4;
  undefined1 local_5ac;
  int32_t local_5a0;
  undefined4 uStack_59c;
  int32_t local_598 [2];
  undefined1 local_590 [48];
  undefined1 local_560 [12];
  undefined4 uStack_554;
  coda_mem_array *local_550;
  int iStack_548;
  undefined1 local_540 [16];
  undefined1 local_530 [12];
  undefined4 uStack_524;
  coda_mem_array *local_520;
  int iStack_518;
  undefined1 local_510 [16];
  undefined1 local_500 [12];
  undefined4 uStack_4f4;
  coda_mem_array *local_4f0;
  int iStack_4e8;
  undefined1 local_4e0 [16];
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [8];
  double dStack_4b8;
  char local_4b0;
  char cStack_4af;
  long local_4a8;
  long local_4a0;
  undefined1 local_498 [16];
  undefined1 local_488 [8];
  coda_mem_array *pcStack_480;
  undefined1 local_478 [16];
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  char local_438 [3];
  char cStack_435;
  char cStack_434;
  char acStack_433 [9];
  char acStack_42a [2];
  uint local_428;
  undefined4 uStack_424;
  undefined4 uStack_420;
  undefined4 uStack_41c;
  undefined4 uStack_418;
  undefined4 uStack_414;
  undefined4 uStack_410;
  undefined4 uStack_40c;
  undefined2 uStack_408;
  char cStack_406;
  undefined4 uStack_405;
  char cStack_401;
  undefined2 local_400;
  char cStack_3fe;
  undefined1 uStack_3fd;
  char local_3fc;
  char cStack_3fb;
  char cStack_3fa;
  char cStack_3f9;
  char cStack_3f8;
  char cStack_3f7;
  char cStack_3f6;
  char cStack_3f5;
  char cStack_3f4;
  char cStack_3f3;
  char cStack_3f2;
  char cStack_3f1;
  char cStack_3f0;
  char cStack_3ef;
  char cStack_3ee;
  char cStack_3ed;
  char local_3ec;
  char cStack_3eb;
  char cStack_3ea;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_590._16_8_ = (coda_mem_record *)0x0;
  local_590._24_4_ = 0;
  local_590._32_16_ = (undefined1  [16])0x0;
  local_560 = SUB1612((undefined1  [16])0x0,0);
  uStack_554 = 0;
  local_550 = (coda_mem_array *)0x0;
  iStack_548 = 0;
  local_540 = (undefined1  [16])0x0;
  local_530 = SUB1612((undefined1  [16])0x0,0);
  uStack_524 = 0;
  local_520 = (coda_mem_array *)0x0;
  iStack_518 = 0;
  local_510 = (undefined1  [16])0x0;
  local_500 = SUB1612((undefined1  [16])0x0,0);
  uStack_4f4 = 0;
  local_4f0 = (coda_mem_array *)0x0;
  iStack_4e8 = 0;
  local_4e0 = (undefined1  [16])0x0;
  local_4d0 = (undefined1  [16])0x0;
  _local_4c0 = (undefined1  [16])0x0;
  local_4b0 = ' ';
  cStack_4af = ' ';
  local_498 = (undefined1  [16])0x0;
  _local_488 = (undefined1  [16])0x0;
  local_478 = (undefined1  [16])0x0;
  uStack_5f0 = 0x1259af;
  local_590._8_8_ = product;
  __stream = fopen(product->filename,"r");
  local_590._0_8_ = __stream;
  if (__stream == (FILE *)0x0) {
    uStack_5f0 = 0x125a27;
    coda_set_error(-0x15,"could not open file %s",product->filename);
    return -1;
  }
  uStack_5f0 = 0x1259c4;
  local_4a0 = ftell(__stream);
  local_4a8 = 1;
  uStack_5f0 = 0x1259e8;
  uVar18 = get_line((FILE *)__stream,local_438);
  if ((int)uVar18 < 0) goto LAB_00125a89;
  if (uVar18 < 0x3d) {
    pcVar29 = (char *)(long)(int)uVar18;
    goto LAB_001259f8;
  }
  auVar64[0] = -((char)_local_3ec == 'T');
  auVar64[1] = -((char)((uint)_local_3ec >> 8) == 'Y');
  auVar64[2] = -((char)((uint)_local_3ec >> 0x10) == 'P');
  auVar64[3] = -((char)((uint)_local_3ec >> 0x18) == 'E');
  auVar64[4] = 0xff;
  auVar64[5] = 0xff;
  auVar64[6] = 0xff;
  auVar64[7] = 0xff;
  auVar64[8] = 0xff;
  auVar64[9] = 0xff;
  auVar64[10] = 0xff;
  auVar64[0xb] = 0xff;
  auVar64[0xc] = 0xff;
  auVar64[0xd] = 0xff;
  auVar64[0xe] = 0xff;
  auVar64[0xf] = 0xff;
  auVar32[0] = -(local_3fc == 'R');
  auVar32[1] = -(cStack_3fb == 'I');
  auVar32[2] = -(cStack_3fa == 'N');
  auVar32[3] = -(cStack_3f9 == 'E');
  auVar32[4] = -(cStack_3f8 == 'X');
  auVar32[5] = -(cStack_3f7 == ' ');
  auVar32[6] = -(cStack_3f6 == 'V');
  auVar32[7] = -(cStack_3f5 == 'E');
  auVar32[8] = -(cStack_3f4 == 'R');
  auVar32[9] = -(cStack_3f3 == 'S');
  auVar32[10] = -(cStack_3f2 == 'I');
  auVar32[0xb] = -(cStack_3f1 == 'O');
  auVar32[0xc] = -(cStack_3f0 == 'N');
  auVar32[0xd] = -(cStack_3ef == ' ');
  auVar32[0xe] = -(cStack_3ee == '/');
  auVar32[0xf] = -(cStack_3ed == ' ');
  auVar32 = auVar32 & auVar64;
  if ((ushort)((ushort)(SUB161(auVar32 >> 7,0) & 1) | (ushort)(SUB161(auVar32 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar32 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar32 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar32 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar32 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar32 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar32 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar32 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar32 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar32 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar32 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar32 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar32 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar32 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar32[0xf] >> 7) << 0xf) == 0xffff) {
    uStack_5f0 = 0x125ac6;
    lVar20 = coda_ascii_parse_double(local_438,9,(double *)(local_4c0 + 8),0);
    lVar30 = local_4a0;
    if (lVar20 < 0) {
LAB_00127fd0:
      uStack_5f0 = 0x127fde;
      coda_add_error_message(" (line: %ld, byte offset: %ld)",local_4a8,lVar30);
      goto LAB_00125a89;
    }
    local_4b0 = (char)uStack_424;
    uVar18 = uStack_424 & 0xff;
    if (uVar18 == 0x43) {
      lVar30 = 0x470;
      if (((dStack_4b8 == 2.0) && (!NAN(dStack_4b8))) || ((dStack_4b8 == 3.0 && (!NAN(dStack_4b8))))
         ) {
LAB_00125b92:
        uStack_5f0 = 0x125ba6;
        local_590._16_8_ =
             coda_mem_record_new(*(coda_type_record **)(*(long *)(in_FS_OFFSET + -0x118) + lVar30),
                                 (coda_dynamic_type *)0x0);
        uVar1 = uStack_410;
        if (dStack_4b8 != 3.0) {
          uVar1 = 0x47;
        }
        cStack_4af = (char)uVar1;
        if (NAN(dStack_4b8)) {
          cStack_4af = 'G';
        }
        uStack_5f0 = 0x125bf1;
        pcVar21 = coda_mem_float_new((coda_type_number *)**(undefined8 **)(in_FS_OFFSET + -0x118),
                                     (coda_dynamic_type *)0x0,(coda_product *)local_590._8_8_,
                                     (float)dStack_4b8);
        uStack_5f0 = 0x125c07;
        coda_mem_record_add_field
                  ((coda_mem_record *)local_590._16_8_,"format_version",(coda_dynamic_type *)pcVar21
                   ,0);
        uStack_5f0 = 0x125c28;
        pcVar21 = coda_mem_char_new(*(coda_type_text **)(*(long *)(in_FS_OFFSET + -0x118) + 8),
                                    (coda_dynamic_type *)0x0,(coda_product *)local_590._8_8_,
                                    local_4b0);
        uStack_5f0 = 0x125c3e;
        coda_mem_record_add_field
                  ((coda_mem_record *)local_590._16_8_,"file_type",(coda_dynamic_type *)pcVar21,0);
        uStack_5f0 = 0x125c5f;
        pcVar21 = coda_mem_char_new(*(coda_type_text **)(*(long *)(in_FS_OFFSET + -0x118) + 0x10),
                                    (coda_dynamic_type *)0x0,(coda_product *)local_590._8_8_,
                                    cStack_4af);
        uStack_5f0 = 0x125c75;
        coda_mem_record_add_field
                  ((coda_mem_record *)local_590._16_8_,"satellite_system",
                   (coda_dynamic_type *)pcVar21,0);
        if (local_4b0 == 'N') {
          uStack_5f0 = 0x127027;
          pcVar22 = coda_type_record_new(coda_format_rinex);
          local_498._0_8_ = pcVar22;
          uStack_5f0 = 0x12703b;
          pcVar23 = coda_type_record_field_new("epoch");
          uStack_5f0 = 0x127056;
          coda_type_record_field_set_type
                    (pcVar23,*(coda_type **)(*(long *)(in_FS_OFFSET + -0x118) + 0x168));
          uStack_5f0 = 0x127066;
          coda_type_record_add_field((coda_type_record *)local_498._0_8_,pcVar23);
          uStack_5f0 = 0x127072;
          pcVar23 = coda_type_record_field_new("flag");
          uStack_5f0 = 0x12708d;
          coda_type_record_field_set_type
                    (pcVar23,*(coda_type **)(*(long *)(in_FS_OFFSET + -0x118) + 0x170));
          uStack_5f0 = 0x12709d;
          coda_type_record_add_field((coda_type_record *)local_498._0_8_,pcVar23);
          uStack_5f0 = 0x1270a9;
          pcVar23 = coda_type_record_field_new("receiver_clock_offset");
          uStack_5f0 = 0x1270c4;
          coda_type_record_field_set_type
                    (pcVar23,*(coda_type **)(*(long *)(in_FS_OFFSET + -0x118) + 0x178));
          uStack_5f0 = 0x1270d4;
          coda_type_record_add_field((coda_type_record *)local_498._0_8_,pcVar23);
          uStack_5f0 = 0x1270eb;
          pcVar24 = coda_mem_array_new(*(coda_type_array **)
                                        (*(long *)(in_FS_OFFSET + -0x118) + 0x1d0),
                                       (coda_dynamic_type *)0x0);
          local_478._0_8_ = pcVar24;
          uStack_5f0 = 0x12710a;
          pcVar24 = coda_mem_array_new(*(coda_type_array **)
                                        (*(long *)(in_FS_OFFSET + -0x118) + 0x218),
                                       (coda_dynamic_type *)0x0);
          local_478._8_8_ = pcVar24;
          uStack_5f0 = 0x12711c;
          local_4a0 = ftell((FILE *)local_590._0_8_);
          local_4a8 = local_4a8 + 1;
          uStack_5f0 = 0x12713e;
          uVar18 = get_line((FILE *)local_590._0_8_,local_438);
          if (-1 < (int)uVar18) {
            local_458 = 0x5552202f204d4750;
            uStack_450 = 0x44202f205942204e;
            local_468 = 0x42204e5552202f20;
            uStack_460 = 0x45544144202f2059;
            do {
              pcVar29 = &local_3fc;
              if (uVar18 == 0) {
LAB_00128034:
                uStack_5f0 = 0x128052;
                coda_mem_record_add_field
                          ((coda_mem_record *)local_590._16_8_,"ionospheric_corr",
                           (coda_dynamic_type *)local_478._0_8_,0);
                field_type = local_478._8_8_;
                auVar3._8_8_ = 0;
                auVar3._0_8_ = local_478._8_8_;
                local_478 = auVar3 << 0x40;
                uStack_5f0 = 0x128075;
                coda_mem_record_add_field
                          ((coda_mem_record *)local_590._16_8_,"time_system_corr",
                           (coda_dynamic_type *)field_type,0);
                local_478._8_8_ = 0;
                uStack_5f0 = 0x128087;
                local_4a0 = ftell((FILE *)local_590._0_8_);
                local_4a8 = local_4a8 + 1;
                uStack_5f0 = 0x1280a1;
                iVar19 = coda_mem_record_validate((coda_mem_record *)local_590._16_8_);
                if (iVar19 == 0) {
                  uStack_5f0 = 0x1280c0;
                  local_550 = coda_mem_array_new(*(coda_type_array **)
                                                  (*(long *)(in_FS_OFFSET + -0x118) + 0x400),
                                                 (coda_dynamic_type *)0x0);
                  uStack_5f0 = 0x1280e0;
                  local_520 = coda_mem_array_new(*(coda_type_array **)
                                                  (*(long *)(in_FS_OFFSET + -0x118) + 0x408),
                                                 (coda_dynamic_type *)0x0);
                  uStack_5f0 = 0x1280fb;
                  local_4f0 = coda_mem_array_new(*(coda_type_array **)
                                                  (*(long *)(in_FS_OFFSET + -0x118) + 0x410),
                                                 (coda_dynamic_type *)0x0);
                  uStack_5f0 = 0x128119;
                  pcVar24 = coda_mem_array_new(*(coda_type_array **)
                                                (*(long *)(in_FS_OFFSET + -0x118) + 0x418),
                                               (coda_dynamic_type *)0x0);
                  local_4c0 = (undefined1  [8])pcVar24;
                  uStack_5f0 = 0x128128;
                  iVar19 = read_navigation_records((ingest_info *)local_590);
                  if (iVar19 == 0) {
                    puVar31 = (undefined8 *)local_4c0;
                    uStack_5f0 = 0x128152;
                    pcVar28 = coda_mem_record_new(*(coda_type_record **)
                                                   (*(long *)(in_FS_OFFSET + -0x118) + 0x420),
                                                  (coda_dynamic_type *)0x0);
                    uStack_5f0 = 0x12816e;
                    coda_mem_record_add_field
                              (pcVar28,"header",(coda_dynamic_type *)local_590._16_8_,0);
                    local_590._16_8_ = (coda_mem_record *)0x0;
                    uStack_5f0 = 0x12818f;
                    coda_mem_record_add_field(pcVar28,"gps",(coda_dynamic_type *)local_550,0);
                    local_550 = (coda_mem_array *)0x0;
                    uStack_5f0 = 0x1281ad;
                    coda_mem_record_add_field(pcVar28,"glonass",(coda_dynamic_type *)local_520,0);
                    local_520 = (coda_mem_array *)0x0;
                    uStack_5f0 = 0x1281c8;
                    coda_mem_record_add_field(pcVar28,"galileo",(coda_dynamic_type *)local_4f0,0);
                    local_4f0 = (coda_mem_array *)0x0;
                    pcVar29 = "sbas";
                    iVar19 = 0;
                    field_type_00 = local_4c0;
                    goto LAB_00128518;
                  }
                }
                break;
              }
              if (uVar18 < 0x3d) goto LAB_00127fa9;
              auVar52[0] = -(local_3fc == (char)local_458);
              auVar52[1] = -(cStack_3fb == local_458._1_1_);
              auVar52[2] = -(cStack_3fa == local_458._2_1_);
              auVar52[3] = -(cStack_3f9 == local_458._3_1_);
              auVar52[4] = -(cStack_3f8 == local_458._4_1_);
              auVar52[5] = -(cStack_3f7 == local_458._5_1_);
              auVar52[6] = -(cStack_3f6 == local_458._6_1_);
              auVar52[7] = -(cStack_3f5 == local_458._7_1_);
              auVar52[8] = -(cStack_3f4 == (char)uStack_450);
              auVar52[9] = -(cStack_3f3 == uStack_450._1_1_);
              auVar52[10] = -(cStack_3f2 == uStack_450._2_1_);
              auVar52[0xb] = -(cStack_3f1 == uStack_450._3_1_);
              auVar52[0xc] = -(cStack_3f0 == uStack_450._4_1_);
              auVar52[0xd] = -(cStack_3ef == uStack_450._5_1_);
              auVar52[0xe] = -(cStack_3ee == uStack_450._6_1_);
              auVar52[0xf] = -(cStack_3ed == uStack_450._7_1_);
              auVar83[0] = -(cStack_3f9 == (char)local_468);
              auVar83[1] = -(cStack_3f8 == local_468._1_1_);
              auVar83[2] = -(cStack_3f7 == local_468._2_1_);
              auVar83[3] = -(cStack_3f6 == local_468._3_1_);
              auVar83[4] = -(cStack_3f5 == local_468._4_1_);
              auVar83[5] = -(cStack_3f4 == local_468._5_1_);
              auVar83[6] = -(cStack_3f3 == local_468._6_1_);
              auVar83[7] = -(cStack_3f2 == local_468._7_1_);
              auVar83[8] = -(cStack_3f1 == (char)uStack_460);
              auVar83[9] = -(cStack_3f0 == uStack_460._1_1_);
              auVar83[10] = -(cStack_3ef == uStack_460._2_1_);
              auVar83[0xb] = -(cStack_3ee == uStack_460._3_1_);
              auVar83[0xc] = -(cStack_3ed == uStack_460._4_1_);
              auVar83[0xd] = -(local_3ec == uStack_460._5_1_);
              auVar83[0xe] = -(cStack_3eb == uStack_460._6_1_);
              auVar83[0xf] = -(cStack_3ea == uStack_460._7_1_);
              auVar83 = auVar83 & auVar52;
              if ((ushort)((ushort)(SUB161(auVar83 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar83 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar83 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar83 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar83 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar83 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar83 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar83 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar83 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar83 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar83 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar83 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar83 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar83 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar83 >> 0x77,0) & 1) << 0xe |
                          (ushort)(byte)(auVar83[0xf] >> 7) << 0xf) == 0xffff) {
                local_5e8 = (char)_local_438;
                cStack_5e7 = (char)((uint)_local_438 >> 8);
                cStack_5e6 = (char)((uint)_local_438 >> 0x10);
                cStack_5e5 = (char)((uint)_local_438 >> 0x18);
                uStack_5e2 = (undefined1)acStack_433._1_2_;
                uStack_5e1 = SUB21(acStack_433._1_2_,1);
                uStack_5e0 = (undefined7)stack0xfffffffffffffbd0;
                cStack_5d9 = (char)((ulong)stack0xfffffffffffffbd0 >> 0x38);
                local_5d8 = (uint5)local_428;
                uStack_5f0 = 0x127305;
                sVar25 = strlen(&local_5e8);
                if (0 < (long)sVar25) {
                  lVar30 = sVar25 + 1;
                  do {
                    if (*(char *)((long)&uStack_5f0 + lVar30 + 6) != ' ') break;
                    *(undefined1 *)((long)&uStack_5f0 + lVar30 + 6) = 0;
                    lVar30 = lVar30 + -1;
                  } while (1 < lVar30);
                }
                uStack_5f0 = 0x12733e;
                pcVar21 = coda_mem_string_new(*(coda_type_text **)
                                               (*(long *)(in_FS_OFFSET + -0x118) + 0x18),
                                              (coda_dynamic_type *)0x0,
                                              (coda_product *)local_590._8_8_,&local_5e8);
                uStack_5f0 = 0x127350;
                coda_mem_record_add_field
                          ((coda_mem_record *)local_590._16_8_,"program",
                           (coda_dynamic_type *)pcVar21,0);
                local_5e8 = (char)uStack_424;
                cStack_5e7 = (char)(uStack_424 >> 8);
                cStack_5e6 = (char)(uStack_424 >> 0x10);
                cStack_5e5 = (char)(uStack_424 >> 0x18);
                cStack_5e4 = (char)uStack_420;
                cStack_5e3 = (char)((uint)uStack_420 >> 8);
                uStack_5e2 = (undefined1)((uint)uStack_420 >> 0x10);
                uStack_5e1 = (undefined1)((uint)uStack_420 >> 0x18);
                uStack_5e0 = (undefined7)CONCAT44(uStack_418,uStack_41c);
                cStack_5d9 = (char)((uint)uStack_418 >> 0x18);
                _local_5d8 = CONCAT44(stack0xfffffffffffffa2c,uStack_414);
                uStack_5f0 = 0x12736b;
                sVar25 = strlen(&local_5e8);
                if (0 < (long)sVar25) {
                  lVar30 = sVar25 + 1;
                  do {
                    if (*(char *)((long)&uStack_5f0 + lVar30 + 6) != ' ') break;
                    *(undefined1 *)((long)&uStack_5f0 + lVar30 + 6) = 0;
                    lVar30 = lVar30 + -1;
                  } while (1 < lVar30);
                }
                uStack_5f0 = 0x1273a4;
                pcVar21 = coda_mem_string_new(*(coda_type_text **)
                                               (*(long *)(in_FS_OFFSET + -0x118) + 0x20),
                                              (coda_dynamic_type *)0x0,
                                              (coda_product *)local_590._8_8_,&local_5e8);
                uStack_5f0 = 0x1273ba;
                coda_mem_record_add_field
                          ((coda_mem_record *)local_590._16_8_,"run_by",(coda_dynamic_type *)pcVar21
                           ,0);
                local_5e8 = (char)uStack_410;
                cStack_5e7 = (char)((uint)uStack_410 >> 8);
                cStack_5e6 = (char)((uint)uStack_410 >> 0x10);
                cStack_5e5 = (char)((uint)uStack_410 >> 0x18);
                cStack_5e4 = (char)uStack_40c;
                cStack_5e3 = (char)((uint)uStack_40c >> 8);
                uStack_5e2 = (undefined1)((uint)uStack_40c >> 0x10);
                uStack_5e1 = uStack_40c._3_1_;
                uStack_5e0 = (undefined7)
                             (CONCAT44(uStack_405,
                                       CONCAT13(cStack_406,CONCAT21(uStack_408,uStack_40c._3_1_)))
                             >> 8);
                cStack_5d9 = '\0';
                uStack_5f0 = 0x1273ec;
                pcVar21 = coda_mem_string_new(*(coda_type_text **)
                                               (*(long *)(in_FS_OFFSET + -0x118) + 0x30),
                                              (coda_dynamic_type *)0x0,
                                              (coda_product *)local_590._8_8_,&local_5e8);
                uStack_5f0 = 0x127403;
                pcVar26 = coda_mem_time_new(*(coda_type_special **)
                                             (*(long *)(in_FS_OFFSET + -0x118) + 0x28),
                                            (coda_dynamic_type *)0x0,(coda_dynamic_type *)pcVar21);
                uStack_5f0 = 0x127419;
                coda_mem_record_add_field
                          ((coda_mem_record *)local_590._16_8_,"datetime",
                           (coda_dynamic_type *)pcVar26,0);
                local_5e8 = (char)local_400;
                cStack_5e7 = (char)((ushort)local_400 >> 8);
                cStack_5e6 = cStack_3fe;
                cStack_5e5 = 0;
                uStack_5f0 = 0x12744b;
                pcVar21 = coda_mem_string_new(*(coda_type_text **)
                                               (*(long *)(in_FS_OFFSET + -0x118) + 0x38),
                                              (coda_dynamic_type *)0x0,
                                              (coda_product *)local_590._8_8_,&local_5e8);
                pcVar29 = "datetime_time_zone";
LAB_00127457:
                uStack_5f0 = 0x127461;
                coda_mem_record_add_field
                          ((coda_mem_record *)local_590._16_8_,pcVar29,(coda_dynamic_type *)pcVar21,
                           0);
              }
              else if (CONCAT13(cStack_3f6,CONCAT12(cStack_3f7,CONCAT11(cStack_3f8,cStack_3f9))) !=
                       0x544e454d ||
                       CONCAT13(cStack_3f9,CONCAT12(cStack_3fa,CONCAT11(cStack_3fb,local_3fc))) !=
                       0x4d4d4f43) {
                auVar53[0] = -(local_3fc == 'I');
                auVar53[1] = -(cStack_3fb == 'O');
                auVar53[2] = -(cStack_3fa == 'N');
                auVar53[3] = -(cStack_3f9 == 'O');
                auVar53[4] = -(cStack_3f8 == 'S');
                auVar53[5] = -(cStack_3f7 == 'P');
                auVar53[6] = -(cStack_3f6 == 'H');
                auVar53[7] = -(cStack_3f5 == 'E');
                auVar53[8] = -(cStack_3f4 == 'R');
                auVar53[9] = -(cStack_3f3 == 'I');
                auVar53[10] = -(cStack_3f2 == 'C');
                auVar53[0xb] = -(cStack_3f1 == ' ');
                auVar53[0xc] = -(cStack_3f0 == 'C');
                auVar53[0xd] = -(cStack_3ef == 'O');
                auVar53[0xe] = -(cStack_3ee == 'R');
                auVar53[0xf] = -(cStack_3ed == 'R');
                if ((ushort)((ushort)(SUB161(auVar53 >> 7,0) & 1) |
                             (ushort)(SUB161(auVar53 >> 0xf,0) & 1) << 1 |
                             (ushort)(SUB161(auVar53 >> 0x17,0) & 1) << 2 |
                             (ushort)(SUB161(auVar53 >> 0x1f,0) & 1) << 3 |
                             (ushort)(SUB161(auVar53 >> 0x27,0) & 1) << 4 |
                             (ushort)(SUB161(auVar53 >> 0x2f,0) & 1) << 5 |
                             (ushort)(SUB161(auVar53 >> 0x37,0) & 1) << 6 |
                             (ushort)(SUB161(auVar53 >> 0x3f,0) & 1) << 7 |
                             (ushort)(SUB161(auVar53 >> 0x47,0) & 1) << 8 |
                             (ushort)(SUB161(auVar53 >> 0x4f,0) & 1) << 9 |
                             (ushort)(SUB161(auVar53 >> 0x57,0) & 1) << 10 |
                             (ushort)(SUB161(auVar53 >> 0x5f,0) & 1) << 0xb |
                             (ushort)(SUB161(auVar53 >> 0x67,0) & 1) << 0xc |
                             (ushort)(SUB161(auVar53 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar53 >> 0x77,0) & 1) << 0xe |
                            (ushort)(auVar53[0xf] >> 7) << 0xf) == 0xffff) {
                  uStack_5f0 = 0x1274b1;
                  pcVar28 = coda_mem_record_new(*(coda_type_record **)
                                                 (*(long *)(in_FS_OFFSET + -0x118) + 0x1c8),
                                                (coda_dynamic_type *)0x0);
                  local_5e8 = (char)_local_438;
                  cStack_5e7 = (char)((uint)_local_438 >> 8);
                  cStack_5e6 = (char)((uint)_local_438 >> 0x10);
                  cStack_5e5 = (char)((uint)_local_438 >> 0x18);
                  cStack_5e4 = '\0';
                  uStack_5f0 = 0x1274cb;
                  sVar25 = strlen(&local_5e8);
                  if (0 < (long)sVar25) {
                    lVar30 = sVar25 + 1;
                    do {
                      if (*(char *)((long)&uStack_5f0 + lVar30 + 6) != ' ') break;
                      *(undefined1 *)((long)&uStack_5f0 + lVar30 + 6) = 0;
                      lVar30 = lVar30 + -1;
                    } while (1 < lVar30);
                  }
                  uStack_5f0 = 0x127507;
                  pcVar21 = coda_mem_string_new(*(coda_type_text **)
                                                 (*(long *)(in_FS_OFFSET + -0x118) + 0x1b0),
                                                (coda_dynamic_type *)0x0,
                                                (coda_product *)local_590._8_8_,&local_5e8);
                  uStack_5f0 = 0x12751b;
                  coda_mem_record_add_field(pcVar28,"type",(coda_dynamic_type *)pcVar21,0);
                  uStack_5f0 = 0x127532;
                  pcVar24 = coda_mem_array_new(*(coda_type_array **)
                                                (*(long *)(in_FS_OFFSET + -0x118) + 0x1c0),
                                               (coda_dynamic_type *)0x0);
                  pcVar29 = acStack_433;
                  lVar30 = 0;
                  do {
                    uStack_5f0 = 0x127554;
                    lVar20 = coda_ascii_parse_double(pcVar29,0xc,(double *)&local_5a0,0);
                    if (lVar20 < 0) {
                      uStack_5f0 = 0x127fb8;
                      coda_dynamic_type_delete((coda_dynamic_type *)pcVar24);
                      uStack_5f0 = 0x127fc0;
                      coda_dynamic_type_delete((coda_dynamic_type *)pcVar28);
                      lVar30 = local_4a0;
                      goto LAB_00127fd0;
                    }
                    uStack_5f0 = 0x12757f;
                    pcVar21 = coda_mem_double_new(*(coda_type_number **)
                                                   (*(long *)(in_FS_OFFSET + -0x118) + 0x1b8),
                                                  (coda_dynamic_type *)0x0,
                                                  (coda_product *)local_590._8_8_,
                                                  (double)CONCAT44(uStack_59c,local_5a0));
                    uStack_5f0 = 0x12758d;
                    coda_mem_array_set_element(pcVar24,lVar30,(coda_dynamic_type *)pcVar21);
                    lVar30 = lVar30 + 1;
                    pcVar29 = pcVar29 + 0xc;
                  } while (lVar30 != 4);
                  uStack_5f0 = 0x1275ae;
                  coda_mem_record_add_field(pcVar28,"parameter",(coda_dynamic_type *)pcVar24,0);
                  uStack_5f0 = 0x1275be;
                  coda_mem_array_add_element
                            ((coda_mem_array *)local_478._0_8_,(coda_dynamic_type *)pcVar28);
                }
                else {
                  auVar54[0] = -(local_3fc == 'T');
                  auVar54[1] = -(cStack_3fb == 'I');
                  auVar54[2] = -(cStack_3fa == 'M');
                  auVar54[3] = -(cStack_3f9 == 'E');
                  auVar54[4] = -(cStack_3f8 == ' ');
                  auVar54[5] = -(cStack_3f7 == 'S');
                  auVar54[6] = -(cStack_3f6 == 'Y');
                  auVar54[7] = -(cStack_3f5 == 'S');
                  auVar54[8] = -(cStack_3f4 == 'T');
                  auVar54[9] = -(cStack_3f3 == 'E');
                  auVar54[10] = -(cStack_3f2 == 'M');
                  auVar54[0xb] = -(cStack_3f1 == ' ');
                  auVar54[0xc] = -(cStack_3f0 == 'C');
                  auVar54[0xd] = -(cStack_3ef == 'O');
                  auVar54[0xe] = -(cStack_3ee == 'R');
                  auVar54[0xf] = -(cStack_3ed == 'R');
                  if ((ushort)((ushort)(SUB161(auVar54 >> 7,0) & 1) |
                               (ushort)(SUB161(auVar54 >> 0xf,0) & 1) << 1 |
                               (ushort)(SUB161(auVar54 >> 0x17,0) & 1) << 2 |
                               (ushort)(SUB161(auVar54 >> 0x1f,0) & 1) << 3 |
                               (ushort)(SUB161(auVar54 >> 0x27,0) & 1) << 4 |
                               (ushort)(SUB161(auVar54 >> 0x2f,0) & 1) << 5 |
                               (ushort)(SUB161(auVar54 >> 0x37,0) & 1) << 6 |
                               (ushort)(SUB161(auVar54 >> 0x3f,0) & 1) << 7 |
                               (ushort)(SUB161(auVar54 >> 0x47,0) & 1) << 8 |
                               (ushort)(SUB161(auVar54 >> 0x4f,0) & 1) << 9 |
                               (ushort)(SUB161(auVar54 >> 0x57,0) & 1) << 10 |
                               (ushort)(SUB161(auVar54 >> 0x5f,0) & 1) << 0xb |
                               (ushort)(SUB161(auVar54 >> 0x67,0) & 1) << 0xc |
                               (ushort)(SUB161(auVar54 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar54 >> 0x77,0) & 1) << 0xe |
                              (ushort)(auVar54[0xf] >> 7) << 0xf) != 0xffff) {
                    if (CONCAT13(cStack_3f1,CONCAT12(cStack_3f2,CONCAT11(cStack_3f3,cStack_3f4))) ==
                        0x53444e4f &&
                        CONCAT17(cStack_3f5,
                                 CONCAT16(cStack_3f6,
                                          CONCAT15(cStack_3f7,
                                                   CONCAT14(cStack_3f8,
                                                            CONCAT13(cStack_3f9,
                                                                     CONCAT12(cStack_3fa,
                                                                              CONCAT11(cStack_3fb,
                                                                                       local_3fc))))
                                                  ))) == 0x434553205041454c) {
                      uStack_5f0 = 0x1272a5;
                      lVar20 = coda_ascii_parse_int64(local_438,6,(int64_t *)local_598,0);
                      lVar30 = local_4a0;
                      if (-1 < lVar20) {
                        uStack_5f0 = 0x1272ce;
                        pcVar21 = coda_mem_int32_new(*(coda_type_number **)
                                                      (*(long *)(in_FS_OFFSET + -0x118) + 0x148),
                                                     (coda_dynamic_type *)0x0,
                                                     (coda_product *)local_590._8_8_,local_598[0]);
                        pcVar29 = "leap_seconds";
                        goto LAB_00127457;
                      }
                      goto LAB_00127fd0;
                    }
                    if (CONCAT17(cStack_3f0,
                                 CONCAT16(cStack_3f1,
                                          CONCAT15(cStack_3f2,
                                                   CONCAT14(cStack_3f3,
                                                            CONCAT13(cStack_3f4,
                                                                     CONCAT12(cStack_3f5,
                                                                              CONCAT11(cStack_3f6,
                                                                                       cStack_3f7)))
                                                           )))) == 0x5245444145482046 &&
                        CONCAT17(cStack_3f5,
                                 CONCAT16(cStack_3f6,
                                          CONCAT15(cStack_3f7,
                                                   CONCAT14(cStack_3f8,
                                                            CONCAT13(cStack_3f9,
                                                                     CONCAT12(cStack_3fa,
                                                                              CONCAT11(cStack_3fb,
                                                                                       local_3fc))))
                                                  ))) == 0x4820464f20444e45) goto LAB_00128034;
                    message = "invalid header item \'%s\' (line: %ld, byte offset: %ld)";
                    lVar30 = local_4a0 + 0x3c;
                    goto LAB_00125a82;
                  }
                  uStack_5f0 = 0x1275f1;
                  pcVar28 = coda_mem_record_new(*(coda_type_record **)
                                                 (*(long *)(in_FS_OFFSET + -0x118) + 0x210),
                                                (coda_dynamic_type *)0x0);
                  local_5e8 = (char)_local_438;
                  cStack_5e7 = (char)((uint)_local_438 >> 8);
                  cStack_5e6 = (char)((uint)_local_438 >> 0x10);
                  cStack_5e5 = (char)((uint)_local_438 >> 0x18);
                  cStack_5e4 = '\0';
                  uStack_5f0 = 0x12760b;
                  sVar25 = strlen(&local_5e8);
                  if (0 < (long)sVar25) {
                    lVar30 = sVar25 + 1;
                    do {
                      if (*(char *)((long)&uStack_5f0 + lVar30 + 6) != ' ') break;
                      *(undefined1 *)((long)&uStack_5f0 + lVar30 + 6) = 0;
                      lVar30 = lVar30 + -1;
                    } while (1 < lVar30);
                  }
                  uStack_5f0 = 0x12764a;
                  pcVar21 = coda_mem_string_new(*(coda_type_text **)
                                                 (*(long *)(in_FS_OFFSET + -0x118) + 0x1d8),
                                                (coda_dynamic_type *)0x0,
                                                (coda_product *)local_590._8_8_,&local_5e8);
                  uStack_5f0 = 0x12765e;
                  coda_mem_record_add_field(pcVar28,"type",(coda_dynamic_type *)pcVar21,0);
                  local_448 = CONCAT71(local_448._1_7_,cStack_5e7 == 'B' && local_5e8 == 'S');
                  uStack_5f0 = 0x127690;
                  lVar30 = coda_ascii_parse_double(acStack_433,0x11,(double *)&local_5a0,0);
                  if (lVar30 < 0) {
                    uStack_5f0 = 0x1281ea;
                    coda_dynamic_type_delete((coda_dynamic_type *)pcVar28);
                    lVar30 = local_4a0 + 5;
                    goto LAB_00127fd0;
                  }
                  uStack_5f0 = 0x1276bb;
                  pcVar21 = coda_mem_double_new(*(coda_type_number **)
                                                 (*(long *)(in_FS_OFFSET + -0x118) + 0x1e0),
                                                (coda_dynamic_type *)0x0,
                                                (coda_product *)local_590._8_8_,
                                                (double)CONCAT44(uStack_59c,local_5a0));
                  uStack_5f0 = 0x1276cf;
                  coda_mem_record_add_field(pcVar28,"a0",(coda_dynamic_type *)pcVar21,0);
                  uStack_5f0 = 0x1276e6;
                  lVar30 = coda_ascii_parse_double
                                     ((char *)((long)&uStack_424 + 2),0x10,(double *)&local_5a0,0);
                  if (lVar30 < 0) {
                    uStack_5f0 = 0x12820b;
                    coda_dynamic_type_delete((coda_dynamic_type *)pcVar28);
                    lVar30 = local_4a0 + 0x16;
                    goto LAB_00127fd0;
                  }
                  uStack_5f0 = 0x127711;
                  pcVar21 = coda_mem_double_new(*(coda_type_number **)
                                                 (*(long *)(in_FS_OFFSET + -0x118) + 0x1e8),
                                                (coda_dynamic_type *)0x0,
                                                (coda_product *)local_590._8_8_,
                                                (double)CONCAT44(uStack_59c,local_5a0));
                  uStack_5f0 = 0x127725;
                  coda_mem_record_add_field(pcVar28,"a1",(coda_dynamic_type *)pcVar21,0);
                  uStack_5f0 = 0x12773c;
                  lVar30 = coda_ascii_parse_int64
                                     ((char *)((long)&uStack_414 + 2),7,(int64_t *)local_598,0);
                  if (lVar30 < 0) {
                    uStack_5f0 = 0x12822c;
                    coda_dynamic_type_delete((coda_dynamic_type *)pcVar28);
                    lVar30 = local_4a0 + 0x26;
                    goto LAB_00127fd0;
                  }
                  uStack_5f0 = 0x127768;
                  pcVar21 = coda_mem_int32_new(*(coda_type_number **)
                                                (*(long *)(in_FS_OFFSET + -0x118) + 0x1f0),
                                               (coda_dynamic_type *)0x0,
                                               (coda_product *)local_590._8_8_,local_598[0]);
                  uStack_5f0 = 0x12777c;
                  coda_mem_record_add_field(pcVar28,"T",(coda_dynamic_type *)pcVar21,0);
                  uStack_5f0 = 0x127793;
                  lVar30 = coda_ascii_parse_int64
                                     ((char *)((long)&uStack_40c + 1),5,(int64_t *)local_598,0);
                  if (lVar30 < 0) {
                    uStack_5f0 = 0x12824d;
                    coda_dynamic_type_delete((coda_dynamic_type *)pcVar28);
                    lVar30 = local_4a0 + 0x2d;
                    goto LAB_00127fd0;
                  }
                  uStack_5f0 = 0x1277bd;
                  pcVar21 = coda_mem_int16_new(*(coda_type_number **)
                                                (*(long *)(in_FS_OFFSET + -0x118) + 0x1f8),
                                               (coda_dynamic_type *)0x0,
                                               (coda_product *)local_590._8_8_,
                                               (uint16_t)local_598[0]);
                  uStack_5f0 = 0x1277d1;
                  coda_mem_record_add_field(pcVar28,"W",(coda_dynamic_type *)pcVar21,0);
                  if ((char)local_448 != '\0') {
                    cStack_5e4 = cStack_401;
                    local_5e8 = (char)uStack_405;
                    cStack_5e7 = (char)((uint)uStack_405 >> 8);
                    cStack_5e6 = (char)((uint)uStack_405 >> 0x10);
                    cStack_5e5 = (char)((uint)uStack_405 >> 0x18);
                    cStack_5e3 = '\0';
                    uStack_5f0 = 0x1277fb;
                    sVar25 = strlen(&local_5e8);
                    if (0 < (long)sVar25) {
                      lVar30 = sVar25 + 1;
                      do {
                        if (*(char *)((long)&uStack_5f0 + lVar30 + 6) != ' ') break;
                        *(undefined1 *)((long)&uStack_5f0 + lVar30 + 6) = 0;
                        lVar30 = lVar30 + -1;
                      } while (1 < lVar30);
                    }
                    uStack_5f0 = 0x127837;
                    pcVar21 = coda_mem_string_new(*(coda_type_text **)
                                                   (*(long *)(in_FS_OFFSET + -0x118) + 0x200),
                                                  (coda_dynamic_type *)0x0,
                                                  (coda_product *)local_590._8_8_,&local_5e8);
                    uStack_5f0 = 0x12784b;
                    coda_mem_record_add_field(pcVar28,"S",(coda_dynamic_type *)pcVar21,0);
                    uStack_5f0 = 0x127862;
                    lVar30 = coda_ascii_parse_int64
                                       ((char *)((long)&local_400 + 1),2,(int64_t *)local_598,0);
                    if (lVar30 < 0) {
                      uStack_5f0 = 0x12826e;
                      coda_dynamic_type_delete((coda_dynamic_type *)pcVar28);
                      lVar30 = local_4a0 + 0x39;
                      goto LAB_00127fd0;
                    }
                    uStack_5f0 = 0x12788c;
                    pcVar21 = coda_mem_uint8_new(*(coda_type_number **)
                                                  (*(long *)(in_FS_OFFSET + -0x118) + 0x208),
                                                 (coda_dynamic_type *)0x0,
                                                 (coda_product *)local_590._8_8_,
                                                 (uint8_t)local_598[0]);
                    uStack_5f0 = 0x1278a0;
                    coda_mem_record_add_field(pcVar28,"U",(coda_dynamic_type *)pcVar21,0);
                  }
                  uStack_5f0 = 0x1278b0;
                  coda_mem_array_add_element
                            ((coda_mem_array *)local_478._8_8_,(coda_dynamic_type *)pcVar28);
                }
              }
              uStack_5f0 = 0x12746b;
              local_4a0 = ftell((FILE *)local_590._0_8_);
              local_4a8 = local_4a8 + 1;
              uStack_5f0 = 0x12748d;
              uVar18 = get_line((FILE *)local_590._0_8_,local_438);
            } while (-1 < (int)uVar18);
          }
          goto LAB_00125a89;
        }
        if (local_4b0 != 'O') {
          uStack_5f0 = 0x1278d6;
          pcVar24 = coda_mem_array_new(*(coda_type_array **)
                                        (*(long *)(in_FS_OFFSET + -0x118) + 0x100),
                                       (coda_dynamic_type *)0x0);
          local_488 = (undefined1  [8])pcVar24;
          uStack_5f0 = 0x1278e8;
          local_4a0 = ftell((FILE *)local_590._0_8_);
          local_4a8 = local_4a8 + 1;
          uStack_5f0 = 0x12790a;
          uVar18 = get_line((FILE *)local_590._0_8_,local_438);
          if (-1 < (int)uVar18) {
            local_458 = 0x5552202f204d4750;
            uStack_450 = 0x44202f205942204e;
            local_468 = 0x42204e5552202f20;
            uStack_460 = 0x45544144202f2059;
            local_448 = 0x2023202f20535953;
            uStack_440 = 0x59542053424f202f;
            local_48 = 0x4f202f2023202f20;
            uStack_40 = 0x5345505954205342;
            do {
              if (uVar18 == 0) {
LAB_00128332:
                uStack_5f0 = 0x12834d;
                coda_mem_record_add_field
                          ((coda_mem_record *)local_590._16_8_,"sys",(coda_dynamic_type *)local_488,
                           0);
                auVar4._8_8_ = 0;
                auVar4._0_8_ = pcStack_480;
                _local_488 = auVar4 << 0x40;
                uStack_5f0 = 0x128363;
                local_4a0 = ftell((FILE *)local_590._0_8_);
                local_4a8 = local_4a8 + 1;
                uStack_5f0 = 0x12837d;
                iVar19 = coda_mem_record_validate((coda_mem_record *)local_590._16_8_);
                if (iVar19 == 0) {
                  uStack_5f0 = 0x12838f;
                  pcVar27 = coda_type_array_new(coda_format_rinex);
                  uStack_5f0 = 0x12839c;
                  coda_type_array_add_variable_dimension(pcVar27,(coda_expression *)0x0);
                  uStack_5f0 = 0x1283b4;
                  coda_type_array_set_base_type
                            (pcVar27,*(coda_type **)(*(long *)(in_FS_OFFSET + -0x118) + 0x478));
                  uStack_5f0 = 0x1283be;
                  pcVar24 = coda_mem_array_new(pcVar27,(coda_dynamic_type *)0x0);
                  pcStack_480 = pcVar24;
                  uStack_5f0 = 0x1283d2;
                  coda_type_release((coda_type *)pcVar27);
                  uStack_5f0 = 0x1283da;
                  iVar19 = read_clock_records((ingest_info *)local_590);
                  goto LAB_001284ab;
                }
                break;
              }
              if (uVar18 < 0x3d) goto LAB_00127fa9;
              auVar55[0] = -(local_3fc == (char)local_458);
              auVar55[1] = -(cStack_3fb == local_458._1_1_);
              auVar55[2] = -(cStack_3fa == local_458._2_1_);
              auVar55[3] = -(cStack_3f9 == local_458._3_1_);
              auVar55[4] = -(cStack_3f8 == local_458._4_1_);
              auVar55[5] = -(cStack_3f7 == local_458._5_1_);
              auVar55[6] = -(cStack_3f6 == local_458._6_1_);
              auVar55[7] = -(cStack_3f5 == local_458._7_1_);
              auVar55[8] = -(cStack_3f4 == (char)uStack_450);
              auVar55[9] = -(cStack_3f3 == uStack_450._1_1_);
              auVar55[10] = -(cStack_3f2 == uStack_450._2_1_);
              auVar55[0xb] = -(cStack_3f1 == uStack_450._3_1_);
              auVar55[0xc] = -(cStack_3f0 == uStack_450._4_1_);
              auVar55[0xd] = -(cStack_3ef == uStack_450._5_1_);
              auVar55[0xe] = -(cStack_3ee == uStack_450._6_1_);
              auVar55[0xf] = -(cStack_3ed == uStack_450._7_1_);
              auVar84[0] = -(cStack_3f9 == (char)local_468);
              auVar84[1] = -(cStack_3f8 == local_468._1_1_);
              auVar84[2] = -(cStack_3f7 == local_468._2_1_);
              auVar84[3] = -(cStack_3f6 == local_468._3_1_);
              auVar84[4] = -(cStack_3f5 == local_468._4_1_);
              auVar84[5] = -(cStack_3f4 == local_468._5_1_);
              auVar84[6] = -(cStack_3f3 == local_468._6_1_);
              auVar84[7] = -(cStack_3f2 == local_468._7_1_);
              auVar84[8] = -(cStack_3f1 == (char)uStack_460);
              auVar84[9] = -(cStack_3f0 == uStack_460._1_1_);
              auVar84[10] = -(cStack_3ef == uStack_460._2_1_);
              auVar84[0xb] = -(cStack_3ee == uStack_460._3_1_);
              auVar84[0xc] = -(cStack_3ed == uStack_460._4_1_);
              auVar84[0xd] = -(local_3ec == uStack_460._5_1_);
              auVar84[0xe] = -(cStack_3eb == uStack_460._6_1_);
              auVar84[0xf] = -(cStack_3ea == uStack_460._7_1_);
              auVar84 = auVar84 & auVar55;
              if ((ushort)((ushort)(SUB161(auVar84 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar84 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar84 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar84 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar84 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar84 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar84 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar84 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar84 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar84 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar84 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar84 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar84 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar84 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar84 >> 0x77,0) & 1) << 0xe |
                          (ushort)(byte)(auVar84[0xf] >> 7) << 0xf) == 0xffff) {
                local_5e8 = (char)_local_438;
                cStack_5e7 = (char)((uint)_local_438 >> 8);
                cStack_5e6 = (char)((uint)_local_438 >> 0x10);
                uStack_5e2 = (undefined1)acStack_433._1_2_;
                uStack_5e1 = SUB21(acStack_433._1_2_,1);
                uStack_5e0 = (undefined7)stack0xfffffffffffffbd0;
                cStack_5d9 = (char)((ulong)stack0xfffffffffffffbd0 >> 0x38);
                local_5d8 = (uint5)local_428;
                uStack_5f0 = 0x127d49;
                cStack_5e5 = cStack_435;
                sVar25 = strlen(&local_5e8);
                if (0 < (long)sVar25) {
                  lVar30 = sVar25 + 1;
                  do {
                    if (*(char *)((long)&uStack_5f0 + lVar30 + 6) != ' ') break;
                    *(undefined1 *)((long)&uStack_5f0 + lVar30 + 6) = 0;
                    lVar30 = lVar30 + -1;
                  } while (1 < lVar30);
                }
                uStack_5f0 = 0x127d82;
                pcVar21 = coda_mem_string_new(*(coda_type_text **)
                                               (*(long *)(in_FS_OFFSET + -0x118) + 0x18),
                                              (coda_dynamic_type *)0x0,
                                              (coda_product *)local_590._8_8_,&local_5e8);
                uStack_5f0 = 0x127d98;
                coda_mem_record_add_field
                          ((coda_mem_record *)local_590._16_8_,"program",
                           (coda_dynamic_type *)pcVar21,0);
                local_5e8 = (char)uStack_424;
                cStack_5e7 = (char)(uStack_424 >> 8);
                cStack_5e6 = (char)(uStack_424 >> 0x10);
                cStack_5e5 = (char)(uStack_424 >> 0x18);
                cStack_5e4 = (char)uStack_420;
                cStack_5e3 = (char)((uint)uStack_420 >> 8);
                uStack_5e2 = (undefined1)((uint)uStack_420 >> 0x10);
                uStack_5e1 = (undefined1)((uint)uStack_420 >> 0x18);
                uStack_5e0 = (undefined7)CONCAT44(uStack_418,uStack_41c);
                cStack_5d9 = (char)((uint)uStack_418 >> 0x18);
                _local_5d8 = CONCAT44(stack0xfffffffffffffa2c,uStack_414);
                uStack_5f0 = 0x127db3;
                sVar25 = strlen(&local_5e8);
                if (0 < (long)sVar25) {
                  lVar30 = sVar25 + 1;
                  do {
                    if (*(char *)((long)&uStack_5f0 + lVar30 + 6) != ' ') break;
                    *(undefined1 *)((long)&uStack_5f0 + lVar30 + 6) = 0;
                    lVar30 = lVar30 + -1;
                  } while (1 < lVar30);
                }
                uStack_5f0 = 0x127dec;
                pcVar21 = coda_mem_string_new(*(coda_type_text **)
                                               (*(long *)(in_FS_OFFSET + -0x118) + 0x20),
                                              (coda_dynamic_type *)0x0,
                                              (coda_product *)local_590._8_8_,&local_5e8);
                uStack_5f0 = 0x127e02;
                coda_mem_record_add_field
                          ((coda_mem_record *)local_590._16_8_,"run_by",(coda_dynamic_type *)pcVar21
                           ,0);
                local_5e8 = (char)uStack_410;
                cStack_5e7 = (char)((uint)uStack_410 >> 8);
                cStack_5e6 = (char)((uint)uStack_410 >> 0x10);
                cStack_5e5 = (char)((uint)uStack_410 >> 0x18);
                cStack_5e4 = (char)uStack_40c;
                cStack_5e3 = (char)((uint)uStack_40c >> 8);
                uStack_5e2 = (undefined1)((uint)uStack_40c >> 0x10);
                uStack_5e1 = uStack_40c._3_1_;
                uStack_5e0 = (undefined7)
                             (CONCAT44(uStack_405,
                                       CONCAT13(cStack_406,CONCAT21(uStack_408,uStack_40c._3_1_)))
                             >> 8);
                cStack_5d9 = '\0';
                uStack_5f0 = 0x127e34;
                pcVar21 = coda_mem_string_new(*(coda_type_text **)
                                               (*(long *)(in_FS_OFFSET + -0x118) + 0x30),
                                              (coda_dynamic_type *)0x0,
                                              (coda_product *)local_590._8_8_,&local_5e8);
                uStack_5f0 = 0x127e4b;
                pcVar26 = coda_mem_time_new(*(coda_type_special **)
                                             (*(long *)(in_FS_OFFSET + -0x118) + 0x28),
                                            (coda_dynamic_type *)0x0,(coda_dynamic_type *)pcVar21);
                uStack_5f0 = 0x127e61;
                coda_mem_record_add_field
                          ((coda_mem_record *)local_590._16_8_,"datetime",
                           (coda_dynamic_type *)pcVar26,0);
                local_5e8 = (char)local_400;
                cStack_5e7 = (char)((ushort)local_400 >> 8);
                cStack_5e6 = cStack_3fe;
                cStack_5e5 = 0;
                uStack_5f0 = 0x127e93;
                pcVar21 = coda_mem_string_new(*(coda_type_text **)
                                               (*(long *)(in_FS_OFFSET + -0x118) + 0x38),
                                              (coda_dynamic_type *)0x0,
                                              (coda_product *)local_590._8_8_,&local_5e8);
                pcVar29 = "datetime_time_zone";
                goto LAB_00127e9f;
              }
              if (CONCAT13(cStack_3f6,CONCAT12(cStack_3f7,CONCAT11(cStack_3f8,cStack_3f9))) !=
                  0x544e454d ||
                  CONCAT13(cStack_3f9,CONCAT12(cStack_3fa,CONCAT11(cStack_3fb,local_3fc))) !=
                  0x4d4d4f43) {
                auVar56[0] = -(local_3fc == (char)local_448);
                auVar56[1] = -(cStack_3fb == local_448._1_1_);
                auVar56[2] = -(cStack_3fa == local_448._2_1_);
                auVar56[3] = -(cStack_3f9 == local_448._3_1_);
                auVar56[4] = -(cStack_3f8 == local_448._4_1_);
                auVar56[5] = -(cStack_3f7 == local_448._5_1_);
                auVar56[6] = -(cStack_3f6 == local_448._6_1_);
                auVar56[7] = -(cStack_3f5 == local_448._7_1_);
                auVar56[8] = -(cStack_3f4 == (char)uStack_440);
                auVar56[9] = -(cStack_3f3 == uStack_440._1_1_);
                auVar56[10] = -(cStack_3f2 == uStack_440._2_1_);
                auVar56[0xb] = -(cStack_3f1 == uStack_440._3_1_);
                auVar56[0xc] = -(cStack_3f0 == uStack_440._4_1_);
                auVar56[0xd] = -(cStack_3ef == uStack_440._5_1_);
                auVar56[0xe] = -(cStack_3ee == uStack_440._6_1_);
                auVar56[0xf] = -(cStack_3ed == uStack_440._7_1_);
                auVar85[0] = -(cStack_3f9 == (char)local_48);
                auVar85[1] = -(cStack_3f8 == local_48._1_1_);
                auVar85[2] = -(cStack_3f7 == local_48._2_1_);
                auVar85[3] = -(cStack_3f6 == local_48._3_1_);
                auVar85[4] = -(cStack_3f5 == local_48._4_1_);
                auVar85[5] = -(cStack_3f4 == local_48._5_1_);
                auVar85[6] = -(cStack_3f3 == local_48._6_1_);
                auVar85[7] = -(cStack_3f2 == local_48._7_1_);
                auVar85[8] = -(cStack_3f1 == (char)uStack_40);
                auVar85[9] = -(cStack_3f0 == uStack_40._1_1_);
                auVar85[10] = -(cStack_3ef == uStack_40._2_1_);
                auVar85[0xb] = -(cStack_3ee == uStack_40._3_1_);
                auVar85[0xc] = -(cStack_3ed == uStack_40._4_1_);
                auVar85[0xd] = -(local_3ec == uStack_40._5_1_);
                auVar85[0xe] = -(cStack_3eb == uStack_40._6_1_);
                auVar85[0xf] = -(cStack_3ea == uStack_40._7_1_);
                auVar85 = auVar85 & auVar56;
                if ((ushort)((ushort)(SUB161(auVar85 >> 7,0) & 1) |
                             (ushort)(SUB161(auVar85 >> 0xf,0) & 1) << 1 |
                             (ushort)(SUB161(auVar85 >> 0x17,0) & 1) << 2 |
                             (ushort)(SUB161(auVar85 >> 0x1f,0) & 1) << 3 |
                             (ushort)(SUB161(auVar85 >> 0x27,0) & 1) << 4 |
                             (ushort)(SUB161(auVar85 >> 0x2f,0) & 1) << 5 |
                             (ushort)(SUB161(auVar85 >> 0x37,0) & 1) << 6 |
                             (ushort)(SUB161(auVar85 >> 0x3f,0) & 1) << 7 |
                             (ushort)(SUB161(auVar85 >> 0x47,0) & 1) << 8 |
                             (ushort)(SUB161(auVar85 >> 0x4f,0) & 1) << 9 |
                             (ushort)(SUB161(auVar85 >> 0x57,0) & 1) << 10 |
                             (ushort)(SUB161(auVar85 >> 0x5f,0) & 1) << 0xb |
                             (ushort)(SUB161(auVar85 >> 0x67,0) & 1) << 0xc |
                             (ushort)(SUB161(auVar85 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar85 >> 0x77,0) & 1) << 0xe |
                            (ushort)(byte)(auVar85[0xf] >> 7) << 0xf) == 0xffff) {
                  uStack_5f0 = 0x127eb8;
                  iVar19 = handle_observation_definition((ingest_info *)local_590,local_438);
                  if (iVar19 != 0) break;
                }
                else {
                  if (CONCAT17(cStack_3ef,
                               CONCAT16(cStack_3f0,
                                        CONCAT15(cStack_3f1,
                                                 CONCAT14(cStack_3f2,
                                                          CONCAT13(cStack_3f3,
                                                                   CONCAT12(cStack_3f4,
                                                                            CONCAT11(cStack_3f5,
                                                                                     cStack_3f6)))))
                                       )) == 0x4449204d45545359 &&
                      CONCAT17(cStack_3f5,
                               CONCAT16(cStack_3f6,
                                        CONCAT15(cStack_3f7,
                                                 CONCAT14(cStack_3f8,
                                                          CONCAT13(cStack_3f9,
                                                                   CONCAT12(cStack_3fa,
                                                                            CONCAT11(cStack_3fb,
                                                                                     local_3fc))))))
                              ) == 0x53595320454d4954) {
                    cStack_5e6 = acStack_433[0];
                    local_5e8 = cStack_435;
                    cStack_5e7 = cStack_434;
                    cStack_5e5 = 0;
                    uStack_5f0 = 0x127f12;
                    sVar25 = strlen(&local_5e8);
                    if (0 < (long)sVar25) {
                      lVar30 = sVar25 + 1;
                      do {
                        if (*(char *)((long)&uStack_5f0 + lVar30 + 6) != ' ') break;
                        *(undefined1 *)((long)&uStack_5f0 + lVar30 + 6) = 0;
                        lVar30 = lVar30 + -1;
                      } while (1 < lVar30);
                    }
                    uStack_5f0 = 0x127f4e;
                    pcVar21 = coda_mem_string_new(*(coda_type_text **)
                                                   (*(long *)(in_FS_OFFSET + -0x118) + 0x158),
                                                  (coda_dynamic_type *)0x0,
                                                  (coda_product *)local_590._8_8_,&local_5e8);
                    pcVar29 = "time_system_id";
                  }
                  else {
                    if (CONCAT13(cStack_3f1,CONCAT12(cStack_3f2,CONCAT11(cStack_3f3,cStack_3f4))) !=
                        0x53444e4f ||
                        CONCAT17(cStack_3f5,
                                 CONCAT16(cStack_3f6,
                                          CONCAT15(cStack_3f7,
                                                   CONCAT14(cStack_3f8,
                                                            CONCAT13(cStack_3f9,
                                                                     CONCAT12(cStack_3fa,
                                                                              CONCAT11(cStack_3fb,
                                                                                       local_3fc))))
                                                  ))) != 0x434553205041454c) {
                      auVar57[0] = -(local_3fc == 'S');
                      auVar57[1] = -(cStack_3fb == 'Y');
                      auVar57[2] = -(cStack_3fa == 'S');
                      auVar57[3] = -(cStack_3f9 == ' ');
                      auVar57[4] = -(cStack_3f8 == '/');
                      auVar57[5] = -(cStack_3f7 == ' ');
                      auVar57[6] = -(cStack_3f6 == 'D');
                      auVar57[7] = -(cStack_3f5 == 'C');
                      auVar57[8] = -(cStack_3f4 == 'B');
                      auVar57[9] = -(cStack_3f3 == 'S');
                      auVar57[10] = -(cStack_3f2 == ' ');
                      auVar57[0xb] = -(cStack_3f1 == 'A');
                      auVar57[0xc] = -(cStack_3f0 == 'P');
                      auVar57[0xd] = -(cStack_3ef == 'P');
                      auVar57[0xe] = -(cStack_3ee == 'L');
                      auVar57[0xf] = -(cStack_3ed == 'I');
                      auVar86[0] = -(local_3ec == 'E');
                      auVar86[1] = -(cStack_3eb == 'D');
                      auVar86[2] = 0xff;
                      auVar86[3] = 0xff;
                      auVar86[4] = 0xff;
                      auVar86[5] = 0xff;
                      auVar86[6] = 0xff;
                      auVar86[7] = 0xff;
                      auVar86[8] = 0xff;
                      auVar86[9] = 0xff;
                      auVar86[10] = 0xff;
                      auVar86[0xb] = 0xff;
                      auVar86[0xc] = 0xff;
                      auVar86[0xd] = 0xff;
                      auVar86[0xe] = 0xff;
                      auVar86[0xf] = 0xff;
                      auVar86 = auVar86 & auVar57;
                      if ((((((ushort)((ushort)(SUB161(auVar86 >> 7,0) & 1) |
                                       (ushort)(SUB161(auVar86 >> 0xf,0) & 1) << 1 |
                                       (ushort)(SUB161(auVar86 >> 0x17,0) & 1) << 2 |
                                       (ushort)(SUB161(auVar86 >> 0x1f,0) & 1) << 3 |
                                       (ushort)(SUB161(auVar86 >> 0x27,0) & 1) << 4 |
                                       (ushort)(SUB161(auVar86 >> 0x2f,0) & 1) << 5 |
                                       (ushort)(SUB161(auVar86 >> 0x37,0) & 1) << 6 |
                                       (ushort)(SUB161(auVar86 >> 0x3f,0) & 1) << 7 |
                                       (ushort)(SUB161(auVar86 >> 0x47,0) & 1) << 8 |
                                       (ushort)(SUB161(auVar86 >> 0x4f,0) & 1) << 9 |
                                       (ushort)(SUB161(auVar86 >> 0x57,0) & 1) << 10 |
                                       (ushort)(SUB161(auVar86 >> 0x5f,0) & 1) << 0xb |
                                       (ushort)(SUB161(auVar86 >> 0x67,0) & 1) << 0xc |
                                       (ushort)(SUB161(auVar86 >> 0x6f,0) & 1) << 0xd |
                                       (ushort)(SUB161(auVar86 >> 0x77,0) & 1) << 0xe |
                                      (ushort)(byte)(auVar86[0xf] >> 7) << 0xf) == 0xffff) ||
                            (auVar58[0] = -(local_3fc == 'S'), auVar58[1] = -(cStack_3fb == 'Y'),
                            auVar58[2] = -(cStack_3fa == 'S'), auVar58[3] = -(cStack_3f9 == ' '),
                            auVar58[4] = -(cStack_3f8 == '/'), auVar58[5] = -(cStack_3f7 == ' '),
                            auVar58[6] = -(cStack_3f6 == 'P'), auVar58[7] = -(cStack_3f5 == 'C'),
                            auVar58[8] = -(cStack_3f4 == 'V'), auVar58[9] = -(cStack_3f3 == 'S'),
                            auVar58[10] = -(cStack_3f2 == ' '), auVar58[0xb] = -(cStack_3f1 == 'A'),
                            auVar58[0xc] = -(cStack_3f0 == 'P'), auVar58[0xd] = -(cStack_3ef == 'P')
                            , auVar58[0xe] = -(cStack_3ee == 'L'),
                            auVar58[0xf] = -(cStack_3ed == 'I'), auVar87[0] = -(local_3ec == 'E'),
                            auVar87[1] = -(cStack_3eb == 'D'), auVar87[2] = 0xff, auVar87[3] = 0xff,
                            auVar87[4] = 0xff, auVar87[5] = 0xff, auVar87[6] = 0xff,
                            auVar87[7] = 0xff, auVar87[8] = 0xff, auVar87[9] = 0xff,
                            auVar87[10] = 0xff, auVar87[0xb] = 0xff, auVar87[0xc] = 0xff,
                            auVar87[0xd] = 0xff, auVar87[0xe] = 0xff, auVar87[0xf] = 0xff,
                            auVar87 = auVar87 & auVar58,
                            (ushort)((ushort)(SUB161(auVar87 >> 7,0) & 1) |
                                     (ushort)(SUB161(auVar87 >> 0xf,0) & 1) << 1 |
                                     (ushort)(SUB161(auVar87 >> 0x17,0) & 1) << 2 |
                                     (ushort)(SUB161(auVar87 >> 0x1f,0) & 1) << 3 |
                                     (ushort)(SUB161(auVar87 >> 0x27,0) & 1) << 4 |
                                     (ushort)(SUB161(auVar87 >> 0x2f,0) & 1) << 5 |
                                     (ushort)(SUB161(auVar87 >> 0x37,0) & 1) << 6 |
                                     (ushort)(SUB161(auVar87 >> 0x3f,0) & 1) << 7 |
                                     (ushort)(SUB161(auVar87 >> 0x47,0) & 1) << 8 |
                                     (ushort)(SUB161(auVar87 >> 0x4f,0) & 1) << 9 |
                                     (ushort)(SUB161(auVar87 >> 0x57,0) & 1) << 10 |
                                     (ushort)(SUB161(auVar87 >> 0x5f,0) & 1) << 0xb |
                                     (ushort)(SUB161(auVar87 >> 0x67,0) & 1) << 0xc |
                                     (ushort)(SUB161(auVar87 >> 0x6f,0) & 1) << 0xd |
                                     (ushort)(SUB161(auVar87 >> 0x77,0) & 1) << 0xe |
                                    (ushort)(byte)(auVar87[0xf] >> 7) << 0xf) == 0xffff)) ||
                           (auVar59[0] = -(local_3fc == '#'), auVar59[1] = -(cStack_3fb == ' '),
                           auVar59[2] = -(cStack_3fa == '/'), auVar59[3] = -(cStack_3f9 == ' '),
                           auVar59[4] = -(cStack_3f8 == 'T'), auVar59[5] = -(cStack_3f7 == 'Y'),
                           auVar59[6] = -(cStack_3f6 == 'P'), auVar59[7] = -(cStack_3f5 == 'E'),
                           auVar59[8] = -(cStack_3f4 == 'S'), auVar59[9] = -(cStack_3f3 == ' '),
                           auVar59[10] = -(cStack_3f2 == 'O'), auVar59[0xb] = -(cStack_3f1 == 'F'),
                           auVar59[0xc] = -(cStack_3f0 == ' '), auVar59[0xd] = -(cStack_3ef == 'D'),
                           auVar59[0xe] = -(cStack_3ee == 'A'), auVar59[0xf] = -(cStack_3ed == 'T'),
                           auVar88[0] = -(local_3ec == 'A'), auVar88[1] = 0xff, auVar88[2] = 0xff,
                           auVar88[3] = 0xff, auVar88[4] = 0xff, auVar88[5] = 0xff,
                           auVar88[6] = 0xff, auVar88[7] = 0xff, auVar88[8] = 0xff,
                           auVar88[9] = 0xff, auVar88[10] = 0xff, auVar88[0xb] = 0xff,
                           auVar88[0xc] = 0xff, auVar88[0xd] = 0xff, auVar88[0xe] = 0xff,
                           auVar88[0xf] = 0xff, auVar88 = auVar88 & auVar59,
                           (ushort)((ushort)(SUB161(auVar88 >> 7,0) & 1) |
                                    (ushort)(SUB161(auVar88 >> 0xf,0) & 1) << 1 |
                                    (ushort)(SUB161(auVar88 >> 0x17,0) & 1) << 2 |
                                    (ushort)(SUB161(auVar88 >> 0x1f,0) & 1) << 3 |
                                    (ushort)(SUB161(auVar88 >> 0x27,0) & 1) << 4 |
                                    (ushort)(SUB161(auVar88 >> 0x2f,0) & 1) << 5 |
                                    (ushort)(SUB161(auVar88 >> 0x37,0) & 1) << 6 |
                                    (ushort)(SUB161(auVar88 >> 0x3f,0) & 1) << 7 |
                                    (ushort)(SUB161(auVar88 >> 0x47,0) & 1) << 8 |
                                    (ushort)(SUB161(auVar88 >> 0x4f,0) & 1) << 9 |
                                    (ushort)(SUB161(auVar88 >> 0x57,0) & 1) << 10 |
                                    (ushort)(SUB161(auVar88 >> 0x5f,0) & 1) << 0xb |
                                    (ushort)(SUB161(auVar88 >> 0x67,0) & 1) << 0xc |
                                    (ushort)(SUB161(auVar88 >> 0x6f,0) & 1) << 0xd |
                                    (ushort)(SUB161(auVar88 >> 0x77,0) & 1) << 0xe |
                                   (ushort)(byte)(auVar88[0xf] >> 7) << 0xf) == 0xffff)) ||
                          (((auVar60[0] = -(local_3fc == 'S'), auVar60[1] = -(cStack_3fb == 'T'),
                            auVar60[2] = -(cStack_3fa == 'A'), auVar60[3] = -(cStack_3f9 == 'T'),
                            auVar60[4] = -(cStack_3f8 == 'I'), auVar60[5] = -(cStack_3f7 == 'O'),
                            auVar60[6] = -(cStack_3f6 == 'N'), auVar60[7] = -(cStack_3f5 == ' '),
                            auVar60[8] = -(cStack_3f4 == 'N'), auVar60[9] = -(cStack_3f3 == 'A'),
                            auVar60[10] = -(cStack_3f2 == 'M'), auVar60[0xb] = -(cStack_3f1 == 'E'),
                            auVar60[0xc] = -(cStack_3f0 == ' '), auVar60[0xd] = -(cStack_3ef == '/')
                            , auVar60[0xe] = -(cStack_3ee == ' '),
                            auVar60[0xf] = -(cStack_3ed == 'N'), auVar89[0] = -(local_3ec == 'U'),
                            auVar89[1] = -(cStack_3eb == 'M'), auVar89[2] = 0xff, auVar89[3] = 0xff,
                            auVar89[4] = 0xff, auVar89[5] = 0xff, auVar89[6] = 0xff,
                            auVar89[7] = 0xff, auVar89[8] = 0xff, auVar89[9] = 0xff,
                            auVar89[10] = 0xff, auVar89[0xb] = 0xff, auVar89[0xc] = 0xff,
                            auVar89[0xd] = 0xff, auVar89[0xe] = 0xff, auVar89[0xf] = 0xff,
                            auVar89 = auVar89 & auVar60,
                            (ushort)((ushort)(SUB161(auVar89 >> 7,0) & 1) |
                                     (ushort)(SUB161(auVar89 >> 0xf,0) & 1) << 1 |
                                     (ushort)(SUB161(auVar89 >> 0x17,0) & 1) << 2 |
                                     (ushort)(SUB161(auVar89 >> 0x1f,0) & 1) << 3 |
                                     (ushort)(SUB161(auVar89 >> 0x27,0) & 1) << 4 |
                                     (ushort)(SUB161(auVar89 >> 0x2f,0) & 1) << 5 |
                                     (ushort)(SUB161(auVar89 >> 0x37,0) & 1) << 6 |
                                     (ushort)(SUB161(auVar89 >> 0x3f,0) & 1) << 7 |
                                     (ushort)(SUB161(auVar89 >> 0x47,0) & 1) << 8 |
                                     (ushort)(SUB161(auVar89 >> 0x4f,0) & 1) << 9 |
                                     (ushort)(SUB161(auVar89 >> 0x57,0) & 1) << 10 |
                                     (ushort)(SUB161(auVar89 >> 0x5f,0) & 1) << 0xb |
                                     (ushort)(SUB161(auVar89 >> 0x67,0) & 1) << 0xc |
                                     (ushort)(SUB161(auVar89 >> 0x6f,0) & 1) << 0xd |
                                     (ushort)(SUB161(auVar89 >> 0x77,0) & 1) << 0xe |
                                    (ushort)(byte)(auVar89[0xf] >> 7) << 0xf) == 0xffff ||
                            (CONCAT17(cStack_3ee,
                                      CONCAT16(cStack_3ef,
                                               CONCAT15(cStack_3f0,
                                                        CONCAT14(cStack_3f1,
                                                                 CONCAT13(cStack_3f2,
                                                                          CONCAT12(cStack_3f3,
                                                                                   CONCAT11(
                                                  cStack_3f4,cStack_3f5))))))) == 0x464552204b4c4320
                             && CONCAT17(cStack_3f5,
                                         CONCAT16(cStack_3f6,
                                                  CONCAT15(cStack_3f7,
                                                           CONCAT14(cStack_3f8,
                                                                    CONCAT13(cStack_3f9,
                                                                             CONCAT12(cStack_3fa,
                                                                                      CONCAT11(
                                                  cStack_3fb,local_3fc))))))) == 0x204e4f4954415453)
                            ) || ((CONCAT17(cStack_3ee,
                                            CONCAT16(cStack_3ef,
                                                     CONCAT15(cStack_3f0,
                                                              CONCAT14(cStack_3f1,
                                                                       CONCAT13(cStack_3f2,
                                                                                CONCAT12(cStack_3f3,
                                                                                         CONCAT11(
                                                  cStack_3f4,cStack_3f5))))))) == 0x5245544e45432053
                                   && CONCAT17(cStack_3f5,
                                               CONCAT16(cStack_3f6,
                                                        CONCAT15(cStack_3f7,
                                                                 CONCAT14(cStack_3f8,
                                                                          CONCAT13(cStack_3f9,
                                                                                   CONCAT12(
                                                  cStack_3fa,CONCAT11(cStack_3fb,local_3fc))))))) ==
                                      0x534953594c414e41 ||
                                  ((CONCAT13(cStack_3f1,
                                             CONCAT12(cStack_3f2,CONCAT11(cStack_3f3,cStack_3f4)))
                                    == 0x46455220 &&
                                    CONCAT17(cStack_3f5,
                                             CONCAT16(cStack_3f6,
                                                      CONCAT15(cStack_3f7,
                                                               CONCAT14(cStack_3f8,
                                                                        CONCAT13(cStack_3f9,
                                                                                 CONCAT12(cStack_3fa
                                                                                          ,CONCAT11(
                                                  cStack_3fb,local_3fc))))))) == 0x4b4c4320464f2023
                                   || (auVar61[0] = -(local_3fc == 'A'),
                                      auVar61[1] = -(cStack_3fb == 'N'),
                                      auVar61[2] = -(cStack_3fa == 'A'),
                                      auVar61[3] = -(cStack_3f9 == 'L'),
                                      auVar61[4] = -(cStack_3f8 == 'Y'),
                                      auVar61[5] = -(cStack_3f7 == 'S'),
                                      auVar61[6] = -(cStack_3f6 == 'I'),
                                      auVar61[7] = -(cStack_3f5 == 'S'),
                                      auVar61[8] = -(cStack_3f4 == ' '),
                                      auVar61[9] = -(cStack_3f3 == 'C'),
                                      auVar61[10] = -(cStack_3f2 == 'L'),
                                      auVar61[0xb] = -(cStack_3f1 == 'K'),
                                      auVar61[0xc] = -(cStack_3f0 == ' '),
                                      auVar61[0xd] = -(cStack_3ef == 'R'),
                                      auVar61[0xe] = -(cStack_3ee == 'E'),
                                      auVar61[0xf] = -(cStack_3ed == 'F'),
                                      (ushort)((ushort)(SUB161(auVar61 >> 7,0) & 1) |
                                               (ushort)(SUB161(auVar61 >> 0xf,0) & 1) << 1 |
                                               (ushort)(SUB161(auVar61 >> 0x17,0) & 1) << 2 |
                                               (ushort)(SUB161(auVar61 >> 0x1f,0) & 1) << 3 |
                                               (ushort)(SUB161(auVar61 >> 0x27,0) & 1) << 4 |
                                               (ushort)(SUB161(auVar61 >> 0x2f,0) & 1) << 5 |
                                               (ushort)(SUB161(auVar61 >> 0x37,0) & 1) << 6 |
                                               (ushort)(SUB161(auVar61 >> 0x3f,0) & 1) << 7 |
                                               (ushort)(SUB161(auVar61 >> 0x47,0) & 1) << 8 |
                                               (ushort)(SUB161(auVar61 >> 0x4f,0) & 1) << 9 |
                                               (ushort)(SUB161(auVar61 >> 0x57,0) & 1) << 10 |
                                               (ushort)(SUB161(auVar61 >> 0x5f,0) & 1) << 0xb |
                                               (ushort)(SUB161(auVar61 >> 0x67,0) & 1) << 0xc |
                                               (ushort)(SUB161(auVar61 >> 0x6f,0) & 1) << 0xd |
                                               (ushort)(SUB161(auVar61 >> 0x77,0) & 1) << 0xe |
                                              (ushort)(auVar61[0xf] >> 7) << 0xf) == 0xffff))))))))
                         || ((auVar62[0] = -(local_3fc == '#'), auVar62[1] = -(cStack_3fb == ' '),
                             auVar62[2] = -(cStack_3fa == 'O'), auVar62[3] = -(cStack_3f9 == 'F'),
                             auVar62[4] = -(cStack_3f8 == ' '), auVar62[5] = -(cStack_3f7 == 'S'),
                             auVar62[6] = -(cStack_3f6 == 'O'), auVar62[7] = -(cStack_3f5 == 'L'),
                             auVar62[8] = -(cStack_3f4 == 'N'), auVar62[9] = -(cStack_3f3 == ' '),
                             auVar62[10] = -(cStack_3f2 == 'S'), auVar62[0xb] = -(cStack_3f1 == 'T')
                             , auVar62[0xc] = -(cStack_3f0 == 'A'),
                             auVar62[0xd] = -(cStack_3ef == ' '),
                             auVar62[0xe] = -(cStack_3ee == '/'),
                             auVar62[0xf] = -(cStack_3ed == ' '), auVar90[0] = -(cStack_3f9 == 'F'),
                             auVar90[1] = -(cStack_3f8 == ' '), auVar90[2] = -(cStack_3f7 == 'S'),
                             auVar90[3] = -(cStack_3f6 == 'O'), auVar90[4] = -(cStack_3f5 == 'L'),
                             auVar90[5] = -(cStack_3f4 == 'N'), auVar90[6] = -(cStack_3f3 == ' '),
                             auVar90[7] = -(cStack_3f2 == 'S'), auVar90[8] = -(cStack_3f1 == 'T'),
                             auVar90[9] = -(cStack_3f0 == 'A'), auVar90[10] = -(cStack_3ef == ' '),
                             auVar90[0xb] = -(cStack_3ee == '/'),
                             auVar90[0xc] = -(cStack_3ed == ' '), auVar90[0xd] = -(local_3ec == 'T')
                             , auVar90[0xe] = -(cStack_3eb == 'R'),
                             auVar90[0xf] = -(cStack_3ea == 'F'), auVar90 = auVar90 & auVar62,
                             (ushort)((ushort)(SUB161(auVar90 >> 7,0) & 1) |
                                      (ushort)(SUB161(auVar90 >> 0xf,0) & 1) << 1 |
                                      (ushort)(SUB161(auVar90 >> 0x17,0) & 1) << 2 |
                                      (ushort)(SUB161(auVar90 >> 0x1f,0) & 1) << 3 |
                                      (ushort)(SUB161(auVar90 >> 0x27,0) & 1) << 4 |
                                      (ushort)(SUB161(auVar90 >> 0x2f,0) & 1) << 5 |
                                      (ushort)(SUB161(auVar90 >> 0x37,0) & 1) << 6 |
                                      (ushort)(SUB161(auVar90 >> 0x3f,0) & 1) << 7 |
                                      (ushort)(SUB161(auVar90 >> 0x47,0) & 1) << 8 |
                                      (ushort)(SUB161(auVar90 >> 0x4f,0) & 1) << 9 |
                                      (ushort)(SUB161(auVar90 >> 0x57,0) & 1) << 10 |
                                      (ushort)(SUB161(auVar90 >> 0x5f,0) & 1) << 0xb |
                                      (ushort)(SUB161(auVar90 >> 0x67,0) & 1) << 0xc |
                                      (ushort)(SUB161(auVar90 >> 0x6f,0) & 1) << 0xd |
                                      (ushort)(SUB161(auVar90 >> 0x77,0) & 1) << 0xe |
                                     (ushort)(byte)(auVar90[0xf] >> 7) << 0xf) == 0xffff ||
                             (((auVar63[0] = -(local_3fc == 'S'), auVar63[1] = -(cStack_3fb == 'O'),
                               auVar63[2] = -(cStack_3fa == 'L'), auVar63[3] = -(cStack_3f9 == 'N'),
                               auVar63[4] = -(cStack_3f8 == ' '), auVar63[5] = -(cStack_3f7 == 'S'),
                               auVar63[6] = -(cStack_3f6 == 'T'), auVar63[7] = -(cStack_3f5 == 'A'),
                               auVar63[8] = -(cStack_3f4 == ' '), auVar63[9] = -(cStack_3f3 == 'N'),
                               auVar63[10] = -(cStack_3f2 == 'A'),
                               auVar63[0xb] = -(cStack_3f1 == 'M'),
                               auVar63[0xc] = -(cStack_3f0 == 'E'),
                               auVar63[0xd] = -(cStack_3ef == ' '),
                               auVar63[0xe] = -(cStack_3ee == '/'),
                               auVar63[0xf] = -(cStack_3ed == ' '),
                               auVar91[0] = -(cStack_3f9 == 'N'), auVar91[1] = -(cStack_3f8 == ' '),
                               auVar91[2] = -(cStack_3f7 == 'S'), auVar91[3] = -(cStack_3f6 == 'T'),
                               auVar91[4] = -(cStack_3f5 == 'A'), auVar91[5] = -(cStack_3f4 == ' '),
                               auVar91[6] = -(cStack_3f3 == 'N'), auVar91[7] = -(cStack_3f2 == 'A'),
                               auVar91[8] = -(cStack_3f1 == 'M'), auVar91[9] = -(cStack_3f0 == 'E'),
                               auVar91[10] = -(cStack_3ef == ' '),
                               auVar91[0xb] = -(cStack_3ee == '/'),
                               auVar91[0xc] = -(cStack_3ed == ' '),
                               auVar91[0xd] = -(local_3ec == 'N'),
                               auVar91[0xe] = -(cStack_3eb == 'U'),
                               auVar91[0xf] = -(cStack_3ea == 'M'), auVar91 = auVar91 & auVar63,
                               (ushort)((ushort)(SUB161(auVar91 >> 7,0) & 1) |
                                        (ushort)(SUB161(auVar91 >> 0xf,0) & 1) << 1 |
                                        (ushort)(SUB161(auVar91 >> 0x17,0) & 1) << 2 |
                                        (ushort)(SUB161(auVar91 >> 0x1f,0) & 1) << 3 |
                                        (ushort)(SUB161(auVar91 >> 0x27,0) & 1) << 4 |
                                        (ushort)(SUB161(auVar91 >> 0x2f,0) & 1) << 5 |
                                        (ushort)(SUB161(auVar91 >> 0x37,0) & 1) << 6 |
                                        (ushort)(SUB161(auVar91 >> 0x3f,0) & 1) << 7 |
                                        (ushort)(SUB161(auVar91 >> 0x47,0) & 1) << 8 |
                                        (ushort)(SUB161(auVar91 >> 0x4f,0) & 1) << 9 |
                                        (ushort)(SUB161(auVar91 >> 0x57,0) & 1) << 10 |
                                        (ushort)(SUB161(auVar91 >> 0x5f,0) & 1) << 0xb |
                                        (ushort)(SUB161(auVar91 >> 0x67,0) & 1) << 0xc |
                                        (ushort)(SUB161(auVar91 >> 0x6f,0) & 1) << 0xd |
                                        (ushort)(SUB161(auVar91 >> 0x77,0) & 1) << 0xe |
                                       (ushort)(byte)(auVar91[0xf] >> 7) << 0xf) == 0xffff ||
                               (CONCAT17(cStack_3ef,
                                         CONCAT16(cStack_3f0,
                                                  CONCAT15(cStack_3f1,
                                                           CONCAT14(cStack_3f2,
                                                                    CONCAT13(cStack_3f3,
                                                                             CONCAT12(cStack_3f4,
                                                                                      CONCAT11(
                                                  cStack_3f5,cStack_3f6))))))) == 0x53544153204e4c4f
                                && CONCAT17(cStack_3f5,
                                            CONCAT16(cStack_3f6,
                                                     CONCAT15(cStack_3f7,
                                                              CONCAT14(cStack_3f8,
                                                                       CONCAT13(cStack_3f9,
                                                                                CONCAT12(cStack_3fa,
                                                                                         CONCAT11(
                                                  cStack_3fb,local_3fc))))))) == 0x4c4f5320464f2023)
                               ) || (CONCAT17(cStack_3f5,
                                              CONCAT16(cStack_3f6,
                                                       CONCAT15(cStack_3f7,
                                                                CONCAT14(cStack_3f8,
                                                                         CONCAT13(cStack_3f9,
                                                                                  CONCAT12(
                                                  cStack_3fa,CONCAT11(cStack_3fb,local_3fc))))))) ==
                                     0x5453494c204e5250)))))) goto LAB_00127ec0;
                      if (CONCAT17(cStack_3f0,
                                   CONCAT16(cStack_3f1,
                                            CONCAT15(cStack_3f2,
                                                     CONCAT14(cStack_3f3,
                                                              CONCAT13(cStack_3f4,
                                                                       CONCAT12(cStack_3f5,
                                                                                CONCAT11(cStack_3f6,
                                                                                         cStack_3f7)
                                                                               )))))) ==
                          0x5245444145482046 &&
                          CONCAT17(cStack_3f5,
                                   CONCAT16(cStack_3f6,
                                            CONCAT15(cStack_3f7,
                                                     CONCAT14(cStack_3f8,
                                                              CONCAT13(cStack_3f9,
                                                                       CONCAT12(cStack_3fa,
                                                                                CONCAT11(cStack_3fb,
                                                                                         local_3fc))
                                                                      ))))) == 0x4820464f20444e45)
                      goto LAB_00128332;
                      goto LAB_0012830a;
                    }
                    uStack_5f0 = 0x127f73;
                    lVar20 = coda_ascii_parse_int64(local_438,6,(int64_t *)&local_5a0,0);
                    lVar30 = local_4a0;
                    if (lVar20 < 0) goto LAB_00127fd0;
                    uStack_5f0 = 0x127f98;
                    pcVar21 = coda_mem_int32_new(*(coda_type_number **)
                                                  (*(long *)(in_FS_OFFSET + -0x118) + 0x148),
                                                 (coda_dynamic_type *)0x0,
                                                 (coda_product *)local_590._8_8_,local_5a0);
                    pcVar29 = "leap_seconds";
                  }
LAB_00127e9f:
                  uStack_5f0 = 0x127ea9;
                  coda_mem_record_add_field
                            ((coda_mem_record *)local_590._16_8_,pcVar29,
                             (coda_dynamic_type *)pcVar21,0);
                }
              }
LAB_00127ec0:
              uStack_5f0 = 0x127eca;
              local_4a0 = ftell((FILE *)local_590._0_8_);
              local_4a8 = local_4a8 + 1;
              uStack_5f0 = 0x127ee7;
              uVar18 = get_line((FILE *)local_590._0_8_,local_438);
            } while (-1 < (int)uVar18);
          }
          goto LAB_00125a89;
        }
        uStack_5f0 = 0x125c99;
        pcVar22 = coda_type_record_new(coda_format_rinex);
        local_498._0_8_ = pcVar22;
        uStack_5f0 = 0x125cad;
        pcVar23 = coda_type_record_field_new("epoch");
        uStack_5f0 = 0x125cc8;
        coda_type_record_field_set_type
                  (pcVar23,*(coda_type **)(*(long *)(in_FS_OFFSET + -0x118) + 0x168));
        uStack_5f0 = 0x125cd8;
        coda_type_record_add_field((coda_type_record *)local_498._0_8_,pcVar23);
        uStack_5f0 = 0x125ce4;
        pcVar23 = coda_type_record_field_new("flag");
        uStack_5f0 = 0x125cff;
        coda_type_record_field_set_type
                  (pcVar23,*(coda_type **)(*(long *)(in_FS_OFFSET + -0x118) + 0x170));
        uStack_5f0 = 0x125d0f;
        coda_type_record_add_field((coda_type_record *)local_498._0_8_,pcVar23);
        uStack_5f0 = 0x125d1b;
        pcVar23 = coda_type_record_field_new("receiver_clock_offset");
        uStack_5f0 = 0x125d36;
        coda_type_record_field_set_type
                  (pcVar23,*(coda_type **)(*(long *)(in_FS_OFFSET + -0x118) + 0x178));
        uStack_5f0 = 0x125d46;
        coda_type_record_add_field((coda_type_record *)local_498._0_8_,pcVar23);
        uStack_5f0 = 0x125d5d;
        pcVar24 = coda_mem_array_new(*(coda_type_array **)(*(long *)(in_FS_OFFSET + -0x118) + 0x100)
                                     ,(coda_dynamic_type *)0x0);
        local_488 = (undefined1  [8])pcVar24;
        uStack_5f0 = 0x125d6f;
        local_4a0 = ftell((FILE *)local_590._0_8_);
        local_4a8 = local_4a8 + 1;
        uStack_5f0 = 0x125d91;
        uVar18 = get_line((FILE *)local_590._0_8_,local_438);
        if ((int)uVar18 < 0) goto LAB_00125a89;
        local_458 = 0x5552202f204d4750;
        uStack_450 = 0x44202f205942204e;
        local_468 = 0x42204e5552202f20;
        uStack_460 = 0x45544144202f2059;
LAB_00125e0e:
        uVar17 = uStack_5bf;
        uVar16 = uStack_5c0;
        uVar15 = uStack_5c8;
        uVar14 = uStack_5d0;
        cVar13 = cStack_5d9;
        uVar12 = uStack_5e0;
        uVar11 = uStack_5e1;
        uVar10 = uStack_5e2;
        cVar9 = cStack_5e5;
        cVar8 = cStack_5e6;
        cVar7 = cStack_5e7;
        cVar6 = local_5e8;
        if (uVar18 == 0) {
LAB_0012840c:
          uStack_5f0 = 0x128427;
          local_5e8 = cVar6;
          cStack_5e7 = cVar7;
          cStack_5e6 = cVar8;
          cStack_5e5 = cVar9;
          uStack_5e2 = uVar10;
          uStack_5e1 = uVar11;
          uStack_5e0 = uVar12;
          cStack_5d9 = cVar13;
          uStack_5d0 = uVar14;
          uStack_5c8 = uVar15;
          uStack_5c0 = uVar16;
          uStack_5bf = uVar17;
          coda_mem_record_add_field
                    ((coda_mem_record *)local_590._16_8_,"sys",(coda_dynamic_type *)local_488,0);
          auVar5._8_8_ = 0;
          auVar5._0_8_ = pcStack_480;
          _local_488 = auVar5 << 0x40;
          uStack_5f0 = 0x12843d;
          local_4a0 = ftell((FILE *)local_590._0_8_);
          local_4a8 = local_4a8 + 1;
          uStack_5f0 = 0x128457;
          iVar19 = coda_mem_record_validate((coda_mem_record *)local_590._16_8_);
          if (iVar19 == 0) {
            uStack_5f0 = 0x128469;
            pcVar27 = coda_type_array_new(coda_format_rinex);
            uStack_5f0 = 0x128476;
            coda_type_array_add_variable_dimension(pcVar27,(coda_expression *)0x0);
            uStack_5f0 = 0x12848a;
            coda_type_array_set_base_type(pcVar27,(coda_type *)local_498._0_8_);
            uStack_5f0 = 0x128494;
            pcVar24 = coda_mem_array_new(pcVar27,(coda_dynamic_type *)0x0);
            pcStack_480 = pcVar24;
            uStack_5f0 = 0x1284a3;
            coda_type_release((coda_type *)pcVar27);
            uStack_5f0 = 0x1284ab;
            iVar19 = read_observation_records((ingest_info *)local_590);
LAB_001284ab:
            if (iVar19 == 0) {
              puVar31 = (undefined8 *)(local_488 + 8);
              uStack_5f0 = 0x1284c5;
              pcVar22 = coda_type_record_new(coda_format_rinex);
              uStack_5f0 = 0x1284d2;
              pcVar28 = coda_mem_record_new(pcVar22,(coda_dynamic_type *)0x0);
              uStack_5f0 = 0x1284dd;
              coda_type_release((coda_type *)pcVar22);
              uStack_5f0 = 0x1284f9;
              coda_mem_record_add_field(pcVar28,"header",(coda_dynamic_type *)local_590._16_8_,1);
              local_590._16_8_ = (coda_mem_record *)0x0;
              pcVar29 = "record";
              iVar19 = 1;
              field_type_00 = (undefined1  [8])pcStack_480;
LAB_00128518:
              uStack_5f0 = 0x12851d;
              coda_mem_record_add_field(pcVar28,pcVar29,(coda_dynamic_type *)field_type_00,iVar19);
              *puVar31 = 0;
              product->root_type = (coda_dynamic_type *)pcVar28;
              uStack_5f0 = 0x128533;
              ingest_info_cleanup((ingest_info *)local_590);
              return 0;
            }
          }
          goto LAB_00125a89;
        }
        if (uVar18 < 0x3d) goto LAB_00127fa9;
        auVar33[0] = -(local_3fc == (char)local_458);
        auVar33[1] = -(cStack_3fb == local_458._1_1_);
        auVar33[2] = -(cStack_3fa == local_458._2_1_);
        auVar33[3] = -(cStack_3f9 == local_458._3_1_);
        auVar33[4] = -(cStack_3f8 == local_458._4_1_);
        auVar33[5] = -(cStack_3f7 == local_458._5_1_);
        auVar33[6] = -(cStack_3f6 == local_458._6_1_);
        auVar33[7] = -(cStack_3f5 == local_458._7_1_);
        auVar33[8] = -(cStack_3f4 == (char)uStack_450);
        auVar33[9] = -(cStack_3f3 == uStack_450._1_1_);
        auVar33[10] = -(cStack_3f2 == uStack_450._2_1_);
        auVar33[0xb] = -(cStack_3f1 == uStack_450._3_1_);
        auVar33[0xc] = -(cStack_3f0 == uStack_450._4_1_);
        auVar33[0xd] = -(cStack_3ef == uStack_450._5_1_);
        auVar33[0xe] = -(cStack_3ee == uStack_450._6_1_);
        auVar33[0xf] = -(cStack_3ed == uStack_450._7_1_);
        auVar65[0] = -(cStack_3f9 == (char)local_468);
        auVar65[1] = -(cStack_3f8 == local_468._1_1_);
        auVar65[2] = -(cStack_3f7 == local_468._2_1_);
        auVar65[3] = -(cStack_3f6 == local_468._3_1_);
        auVar65[4] = -(cStack_3f5 == local_468._4_1_);
        auVar65[5] = -(cStack_3f4 == local_468._5_1_);
        auVar65[6] = -(cStack_3f3 == local_468._6_1_);
        auVar65[7] = -(cStack_3f2 == local_468._7_1_);
        auVar65[8] = -(cStack_3f1 == (char)uStack_460);
        auVar65[9] = -(cStack_3f0 == uStack_460._1_1_);
        auVar65[10] = -(cStack_3ef == uStack_460._2_1_);
        auVar65[0xb] = -(cStack_3ee == uStack_460._3_1_);
        auVar65[0xc] = -(cStack_3ed == uStack_460._4_1_);
        auVar65[0xd] = -(local_3ec == uStack_460._5_1_);
        auVar65[0xe] = -(cStack_3eb == uStack_460._6_1_);
        auVar65[0xf] = -(cStack_3ea == uStack_460._7_1_);
        auVar65 = auVar65 & auVar33;
        uStack_5e2 = (undefined1)acStack_433._1_2_;
        uStack_5e1 = SUB21(acStack_433._1_2_,1);
        cStack_5d9 = (char)((ulong)stack0xfffffffffffffbd0 >> 0x38);
        uStack_5e0 = (undefined7)stack0xfffffffffffffbd0;
        local_5e8 = (char)_local_438;
        cStack_5e7 = (char)((uint)_local_438 >> 8);
        cStack_5e6 = (char)((uint)_local_438 >> 0x10);
        cStack_5e5 = (char)((uint)_local_438 >> 0x18);
        if ((ushort)((ushort)(SUB161(auVar65 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar65 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar65 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar65 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar65 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar65 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar65 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar65 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar65 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar65 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar65 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar65 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar65 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar65 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar65 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar65[0xf] >> 7) << 0xf) == 0xffff) {
          local_5d8 = (uint5)local_428;
          uStack_5f0 = 0x1263e1;
          sVar25 = strlen(&local_5e8);
          if (0 < (long)sVar25) {
            lVar30 = sVar25 + 1;
            do {
              if (*(char *)((long)&uStack_5f0 + lVar30 + 6) != ' ') break;
              *(undefined1 *)((long)&uStack_5f0 + lVar30 + 6) = 0;
              lVar30 = lVar30 + -1;
            } while (1 < lVar30);
          }
          uStack_5f0 = 0x12641a;
          pcVar21 = coda_mem_string_new(*(coda_type_text **)
                                         (*(long *)(in_FS_OFFSET + -0x118) + 0x18),
                                        (coda_dynamic_type *)0x0,(coda_product *)local_590._8_8_,
                                        &local_5e8);
          uStack_5f0 = 0x126430;
          coda_mem_record_add_field
                    ((coda_mem_record *)local_590._16_8_,"program",(coda_dynamic_type *)pcVar21,0);
          local_5e8 = (char)uStack_424;
          cStack_5e7 = (char)(uStack_424 >> 8);
          cStack_5e6 = (char)(uStack_424 >> 0x10);
          cStack_5e5 = (char)(uStack_424 >> 0x18);
          cStack_5e4 = (char)uStack_420;
          cStack_5e3 = (char)((uint)uStack_420 >> 8);
          uStack_5e2 = (undefined1)((uint)uStack_420 >> 0x10);
          uStack_5e1 = (undefined1)((uint)uStack_420 >> 0x18);
          uStack_5e0 = (undefined7)CONCAT44(uStack_418,uStack_41c);
          cStack_5d9 = (char)((uint)uStack_418 >> 0x18);
          _local_5d8 = CONCAT44(stack0xfffffffffffffa2c,uStack_414);
          uStack_5f0 = 0x12644b;
          sVar25 = strlen(&local_5e8);
          if (0 < (long)sVar25) {
            lVar30 = sVar25 + 1;
            do {
              if (*(char *)((long)&uStack_5f0 + lVar30 + 6) != ' ') break;
              *(undefined1 *)((long)&uStack_5f0 + lVar30 + 6) = 0;
              lVar30 = lVar30 + -1;
            } while (1 < lVar30);
          }
          uStack_5f0 = 0x126484;
          pcVar21 = coda_mem_string_new(*(coda_type_text **)
                                         (*(long *)(in_FS_OFFSET + -0x118) + 0x20),
                                        (coda_dynamic_type *)0x0,(coda_product *)local_590._8_8_,
                                        &local_5e8);
          uStack_5f0 = 0x12649a;
          coda_mem_record_add_field
                    ((coda_mem_record *)local_590._16_8_,"run_by",(coda_dynamic_type *)pcVar21,0);
          local_5e8 = (char)uStack_410;
          cStack_5e7 = (char)((uint)uStack_410 >> 8);
          cStack_5e6 = (char)((uint)uStack_410 >> 0x10);
          cStack_5e5 = (char)((uint)uStack_410 >> 0x18);
          cStack_5e4 = (char)uStack_40c;
          cStack_5e3 = (char)((uint)uStack_40c >> 8);
          uStack_5e2 = (undefined1)((uint)uStack_40c >> 0x10);
          uStack_5e1 = uStack_40c._3_1_;
          uStack_5e0 = (undefined7)
                       (CONCAT44(uStack_405,
                                 CONCAT13(cStack_406,CONCAT21(uStack_408,uStack_40c._3_1_))) >> 8);
          cStack_5d9 = '\0';
          uStack_5f0 = 0x1264cc;
          pcVar21 = coda_mem_string_new(*(coda_type_text **)
                                         (*(long *)(in_FS_OFFSET + -0x118) + 0x30),
                                        (coda_dynamic_type *)0x0,(coda_product *)local_590._8_8_,
                                        &local_5e8);
          uStack_5f0 = 0x1264e3;
          pcVar26 = coda_mem_time_new(*(coda_type_special **)
                                       (*(long *)(in_FS_OFFSET + -0x118) + 0x28),
                                      (coda_dynamic_type *)0x0,(coda_dynamic_type *)pcVar21);
          uStack_5f0 = 0x1264f9;
          coda_mem_record_add_field
                    ((coda_mem_record *)local_590._16_8_,"datetime",(coda_dynamic_type *)pcVar26,0);
          local_5e8 = (char)local_400;
          cStack_5e7 = (char)((ushort)local_400 >> 8);
          cStack_5e6 = cStack_3fe;
          cStack_5e5 = 0;
          uStack_5f0 = 0x12652b;
          pcVar21 = coda_mem_string_new(*(coda_type_text **)
                                         (*(long *)(in_FS_OFFSET + -0x118) + 0x38),
                                        (coda_dynamic_type *)0x0,(coda_product *)local_590._8_8_,
                                        &local_5e8);
          pcVar29 = "datetime_time_zone";
          goto LAB_001269c6;
        }
        if (CONCAT13(cStack_3f6,CONCAT12(cStack_3f7,CONCAT11(cStack_3f8,cStack_3f9))) == 0x544e454d
            && CONCAT13(cStack_3f9,CONCAT12(cStack_3fa,CONCAT11(cStack_3fb,local_3fc))) ==
               0x4d4d4f43) goto LAB_001269d0;
        uStack_5c8 = (undefined3)uStack_418;
        uStack_5d0 = (undefined3)uStack_420;
        uStack_5bf = (undefined2)((uint)uStack_410 >> 8);
        uStack_5c0 = (undefined1)uStack_410;
        if (CONCAT17(cStack_3f2,
                     CONCAT16(cStack_3f3,
                              CONCAT15(cStack_3f4,
                                       CONCAT14(cStack_3f5,
                                                CONCAT13(cStack_3f6,
                                                         CONCAT12(cStack_3f7,
                                                                  CONCAT11(cStack_3f8,cStack_3f9))))
                                      ))) == 0x454d414e2052454b &&
            CONCAT17(cStack_3f5,
                     CONCAT16(cStack_3f6,
                              CONCAT15(cStack_3f7,
                                       CONCAT14(cStack_3f8,
                                                CONCAT13(cStack_3f9,
                                                         CONCAT12(cStack_3fa,
                                                                  CONCAT11(cStack_3fb,local_3fc)))))
                             )) == 0x4e2052454b52414d) {
          uStack_5b4 = CONCAT17(uStack_3fd,
                                CONCAT16(cStack_3fe,
                                         CONCAT24(local_400,CONCAT13(cStack_401,uStack_405._1_3_))))
          ;
          uStack_5b8 = (undefined4)
                       (CONCAT17((undefined1)uStack_405,
                                 CONCAT16(cStack_406,CONCAT24(uStack_408,uStack_40c))) >> 0x20);
          _local_5d8 = CONCAT44(uStack_424,local_428);
          uStack_5c5 = (undefined5)(CONCAT44(uStack_414,uStack_418) >> 0x18);
          uStack_5bd = (undefined1)((uint)uStack_410 >> 0x18);
          uStack_5cd = (undefined5)(CONCAT44(uStack_41c,uStack_420) >> 0x18);
          cStack_5e4 = cStack_434;
          cStack_5e3 = acStack_433[0];
          local_5ac = 0;
          uStack_5f0 = 0x126582;
          sVar25 = strlen(&local_5e8);
          if (0 < (long)sVar25) {
            lVar30 = sVar25 + 1;
            do {
              if (*(char *)((long)&uStack_5f0 + lVar30 + 6) != ' ') break;
              *(undefined1 *)((long)&uStack_5f0 + lVar30 + 6) = 0;
              lVar30 = lVar30 + -1;
            } while (1 < lVar30);
          }
          uStack_5f0 = 0x1265bb;
          pcVar21 = coda_mem_string_new(*(coda_type_text **)
                                         (*(long *)(in_FS_OFFSET + -0x118) + 0x40),
                                        (coda_dynamic_type *)0x0,(coda_product *)local_590._8_8_,
                                        &local_5e8);
          pcVar29 = "marker_name";
LAB_001269c6:
          uStack_5f0 = 0x1269d0;
          coda_mem_record_add_field
                    ((coda_mem_record *)local_590._16_8_,pcVar29,(coda_dynamic_type *)pcVar21,0);
          cVar6 = local_5e8;
          cVar7 = cStack_5e7;
          cVar8 = cStack_5e6;
          cVar9 = cStack_5e5;
          uVar10 = uStack_5e2;
          uVar11 = uStack_5e1;
          uVar12 = uStack_5e0;
          cVar13 = cStack_5d9;
          uVar14 = uStack_5d0;
          uVar15 = uStack_5c8;
          uVar16 = uStack_5c0;
          uVar17 = uStack_5bf;
          goto LAB_001269d0;
        }
        if (CONCAT17(cStack_3f0,
                     CONCAT16(cStack_3f1,
                              CONCAT15(cStack_3f2,
                                       CONCAT14(cStack_3f3,
                                                CONCAT13(cStack_3f4,
                                                         CONCAT12(cStack_3f5,
                                                                  CONCAT11(cStack_3f6,cStack_3f7))))
                                      ))) == 0x5245424d554e2052 &&
            CONCAT17(cStack_3f5,
                     CONCAT16(cStack_3f6,
                              CONCAT15(cStack_3f7,
                                       CONCAT14(cStack_3f8,
                                                CONCAT13(cStack_3f9,
                                                         CONCAT12(cStack_3fa,
                                                                  CONCAT11(cStack_3fb,local_3fc)))))
                             )) == 0x4e2052454b52414d) {
          cStack_5e4 = cStack_434;
          cStack_5e3 = acStack_433[0];
          local_5d8 = (uint5)local_428;
          uStack_5f0 = 0x1265f2;
          uStack_5d0 = uVar14;
          uStack_5c8 = uVar15;
          uStack_5c0 = uVar16;
          uStack_5bf = uVar17;
          sVar25 = strlen(&local_5e8);
          if (0 < (long)sVar25) {
            lVar30 = sVar25 + 1;
            do {
              if (*(char *)((long)&uStack_5f0 + lVar30 + 6) != ' ') break;
              *(undefined1 *)((long)&uStack_5f0 + lVar30 + 6) = 0;
              lVar30 = lVar30 + -1;
            } while (1 < lVar30);
          }
          uStack_5f0 = 0x12662b;
          pcVar21 = coda_mem_string_new(*(coda_type_text **)
                                         (*(long *)(in_FS_OFFSET + -0x118) + 0x48),
                                        (coda_dynamic_type *)0x0,(coda_product *)local_590._8_8_,
                                        &local_5e8);
          pcVar29 = "marker_number";
          goto LAB_001269c6;
        }
        if (CONCAT11(cStack_3f3,cStack_3f4) == 0x5059 &&
            CONCAT17(cStack_3f5,
                     CONCAT16(cStack_3f6,
                              CONCAT15(cStack_3f7,
                                       CONCAT14(cStack_3f8,
                                                CONCAT13(cStack_3f9,
                                                         CONCAT12(cStack_3fa,
                                                                  CONCAT11(cStack_3fb,local_3fc)))))
                             )) == 0x542052454b52414d) {
          cStack_5e4 = cStack_434;
          cStack_5e3 = acStack_433[0];
          local_5d8 = (uint5)local_428;
          uStack_5f0 = 0x126662;
          uStack_5d0 = uVar14;
          uStack_5c8 = uVar15;
          uStack_5c0 = uVar16;
          uStack_5bf = uVar17;
          sVar25 = strlen(&local_5e8);
          if (0 < (long)sVar25) {
            lVar30 = sVar25 + 1;
            do {
              if (*(char *)((long)&uStack_5f0 + lVar30 + 6) != ' ') break;
              *(undefined1 *)((long)&uStack_5f0 + lVar30 + 6) = 0;
              lVar30 = lVar30 + -1;
            } while (1 < lVar30);
          }
          uStack_5f0 = 0x12669b;
          pcVar21 = coda_mem_string_new(*(coda_type_text **)
                                         (*(long *)(in_FS_OFFSET + -0x118) + 0x50),
                                        (coda_dynamic_type *)0x0,(coda_product *)local_590._8_8_,
                                        &local_5e8);
          pcVar29 = "marker_type";
          goto LAB_001269c6;
        }
        auVar34[0] = -(local_3fc == 'O');
        auVar34[1] = -(cStack_3fb == 'B');
        auVar34[2] = -(cStack_3fa == 'S');
        auVar34[3] = -(cStack_3f9 == 'E');
        auVar34[4] = -(cStack_3f8 == 'R');
        auVar34[5] = -(cStack_3f7 == 'V');
        auVar34[6] = -(cStack_3f6 == 'E');
        auVar34[7] = -(cStack_3f5 == 'R');
        auVar34[8] = -(cStack_3f4 == ' ');
        auVar34[9] = -(cStack_3f3 == '/');
        auVar34[10] = -(cStack_3f2 == ' ');
        auVar34[0xb] = -(cStack_3f1 == 'A');
        auVar34[0xc] = -(cStack_3f0 == 'G');
        auVar34[0xd] = -(cStack_3ef == 'E');
        auVar34[0xe] = -(cStack_3ee == 'N');
        auVar34[0xf] = -(cStack_3ed == 'C');
        auVar66[0] = -(local_3ec == 'Y');
        auVar66[1] = 0xff;
        auVar66[2] = 0xff;
        auVar66[3] = 0xff;
        auVar66[4] = 0xff;
        auVar66[5] = 0xff;
        auVar66[6] = 0xff;
        auVar66[7] = 0xff;
        auVar66[8] = 0xff;
        auVar66[9] = 0xff;
        auVar66[10] = 0xff;
        auVar66[0xb] = 0xff;
        auVar66[0xc] = 0xff;
        auVar66[0xd] = 0xff;
        auVar66[0xe] = 0xff;
        auVar66[0xf] = 0xff;
        auVar66 = auVar66 & auVar34;
        if ((ushort)((ushort)(SUB161(auVar66 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar66 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar66 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar66 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar66 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar66 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar66 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar66 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar66 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar66 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar66 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar66 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar66 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar66 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar66 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar66[0xf] >> 7) << 0xf) == 0xffff) {
          local_5d8 = (uint5)local_428;
          uStack_5f0 = 0x1266d2;
          uStack_5d0 = uVar14;
          uStack_5c8 = uVar15;
          uStack_5c0 = uVar16;
          uStack_5bf = uVar17;
          sVar25 = strlen(&local_5e8);
          if (0 < (long)sVar25) {
            lVar30 = sVar25 + 1;
            do {
              if (*(char *)((long)&uStack_5f0 + lVar30 + 6) != ' ') break;
              *(undefined1 *)((long)&uStack_5f0 + lVar30 + 6) = 0;
              lVar30 = lVar30 + -1;
            } while (1 < lVar30);
          }
          uStack_5f0 = 0x12670b;
          pcVar21 = coda_mem_string_new(*(coda_type_text **)
                                         (*(long *)(in_FS_OFFSET + -0x118) + 0x58),
                                        (coda_dynamic_type *)0x0,(coda_product *)local_590._8_8_,
                                        &local_5e8);
          uStack_5f0 = 0x126721;
          coda_mem_record_add_field
                    ((coda_mem_record *)local_590._16_8_,"observer",(coda_dynamic_type *)pcVar21,0);
          _local_5d8 = CONCAT44(uStack_410,uStack_414);
          local_5e8 = (char)uStack_424;
          cStack_5e7 = (char)(uStack_424 >> 8);
          cStack_5e6 = (char)(uStack_424 >> 0x10);
          cStack_5e5 = (char)(uStack_424 >> 0x18);
          cStack_5e4 = (char)uStack_420;
          cStack_5e3 = (char)((uint)uStack_420 >> 8);
          uStack_5e2 = (undefined1)((uint)uStack_420 >> 0x10);
          uStack_5e1 = (undefined1)((uint)uStack_420 >> 0x18);
          uStack_5e0 = (undefined7)CONCAT44(uStack_418,uStack_41c);
          cStack_5d9 = (char)((uint)uStack_418 >> 0x18);
          uStack_5d0 = (undefined3)uStack_40c;
          uStack_5cd = (undefined5)
                       (CONCAT17((undefined1)uStack_405,
                                 CONCAT16(cStack_406,CONCAT24(uStack_408,uStack_40c))) >> 0x18);
          uStack_5c8 = uStack_405._1_3_;
          uStack_5c5 = (undefined5)
                       (CONCAT17(uStack_3fd,
                                 CONCAT16(cStack_3fe,
                                          CONCAT24(local_400,CONCAT13(cStack_401,uStack_405._1_3_)))
                                ) >> 0x18);
          uStack_5c0 = 0;
          uStack_5f0 = 0x12674e;
          sVar25 = strlen(&local_5e8);
          if (0 < (long)sVar25) {
            lVar30 = sVar25 + 1;
            do {
              if (*(char *)((long)&uStack_5f0 + lVar30 + 6) != ' ') break;
              *(undefined1 *)((long)&uStack_5f0 + lVar30 + 6) = 0;
              lVar30 = lVar30 + -1;
            } while (1 < lVar30);
          }
          uStack_5f0 = 0x126787;
          pcVar21 = coda_mem_string_new(*(coda_type_text **)
                                         (*(long *)(in_FS_OFFSET + -0x118) + 0x60),
                                        (coda_dynamic_type *)0x0,(coda_product *)local_590._8_8_,
                                        &local_5e8);
          pcVar29 = "agency";
          goto LAB_001269c6;
        }
        auVar35[0] = -(local_3fc == 'R');
        auVar35[1] = -(cStack_3fb == 'E');
        auVar35[2] = -(cStack_3fa == 'C');
        auVar35[3] = -(cStack_3f9 == ' ');
        auVar35[4] = -(cStack_3f8 == '#');
        auVar35[5] = -(cStack_3f7 == ' ');
        auVar35[6] = -(cStack_3f6 == '/');
        auVar35[7] = -(cStack_3f5 == ' ');
        auVar35[8] = -(cStack_3f4 == 'T');
        auVar35[9] = -(cStack_3f3 == 'Y');
        auVar35[10] = -(cStack_3f2 == 'P');
        auVar35[0xb] = -(cStack_3f1 == 'E');
        auVar35[0xc] = -(cStack_3f0 == ' ');
        auVar35[0xd] = -(cStack_3ef == '/');
        auVar35[0xe] = -(cStack_3ee == ' ');
        auVar35[0xf] = -(cStack_3ed == 'V');
        auVar67[0] = -(cStack_3f9 == ' ');
        auVar67[1] = -(cStack_3f8 == '#');
        auVar67[2] = -(cStack_3f7 == ' ');
        auVar67[3] = -(cStack_3f6 == '/');
        auVar67[4] = -(cStack_3f5 == ' ');
        auVar67[5] = -(cStack_3f4 == 'T');
        auVar67[6] = -(cStack_3f3 == 'Y');
        auVar67[7] = -(cStack_3f2 == 'P');
        auVar67[8] = -(cStack_3f1 == 'E');
        auVar67[9] = -(cStack_3f0 == ' ');
        auVar67[10] = -(cStack_3ef == '/');
        auVar67[0xb] = -(cStack_3ee == ' ');
        auVar67[0xc] = -(cStack_3ed == 'V');
        auVar67[0xd] = -(local_3ec == 'E');
        auVar67[0xe] = -(cStack_3eb == 'R');
        auVar67[0xf] = -(cStack_3ea == 'S');
        auVar67 = auVar67 & auVar35;
        if ((ushort)((ushort)(SUB161(auVar67 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar67 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar67 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar67 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar67 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar67 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar67 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar67 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar67 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar67 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar67 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar67 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar67 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar67 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar67 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar67[0xf] >> 7) << 0xf) == 0xffff) {
          local_5d8 = (uint5)local_428;
          uStack_5f0 = 0x1267be;
          uStack_5d0 = uVar14;
          uStack_5c8 = uVar15;
          uStack_5c0 = uVar16;
          uStack_5bf = uVar17;
          sVar25 = strlen(&local_5e8);
          if (0 < (long)sVar25) {
            lVar30 = sVar25 + 1;
            do {
              if (*(char *)((long)&uStack_5f0 + lVar30 + 6) != ' ') break;
              *(undefined1 *)((long)&uStack_5f0 + lVar30 + 6) = 0;
              lVar30 = lVar30 + -1;
            } while (1 < lVar30);
          }
          uStack_5f0 = 0x1267f7;
          pcVar21 = coda_mem_string_new(*(coda_type_text **)
                                         (*(long *)(in_FS_OFFSET + -0x118) + 0x68),
                                        (coda_dynamic_type *)0x0,(coda_product *)local_590._8_8_,
                                        &local_5e8);
          uStack_5f0 = 0x12680d;
          coda_mem_record_add_field
                    ((coda_mem_record *)local_590._16_8_,"receiver_number",
                     (coda_dynamic_type *)pcVar21,0);
          local_5e8 = (char)uStack_424;
          cStack_5e7 = (char)(uStack_424 >> 8);
          cStack_5e6 = (char)(uStack_424 >> 0x10);
          cStack_5e5 = (char)(uStack_424 >> 0x18);
          cStack_5e4 = (char)uStack_420;
          cStack_5e3 = (char)((uint)uStack_420 >> 8);
          uStack_5e2 = (undefined1)((uint)uStack_420 >> 0x10);
          uStack_5e1 = (undefined1)((uint)uStack_420 >> 0x18);
          uStack_5e0 = (undefined7)CONCAT44(uStack_418,uStack_41c);
          cStack_5d9 = (char)((uint)uStack_418 >> 0x18);
          local_5d8 = (uint5)uStack_414;
          uStack_5f0 = 0x12682d;
          sVar25 = strlen(&local_5e8);
          if (0 < (long)sVar25) {
            lVar30 = sVar25 + 1;
            do {
              if (*(char *)((long)&uStack_5f0 + lVar30 + 6) != ' ') break;
              *(undefined1 *)((long)&uStack_5f0 + lVar30 + 6) = 0;
              lVar30 = lVar30 + -1;
            } while (1 < lVar30);
          }
          uStack_5f0 = 0x126866;
          pcVar21 = coda_mem_string_new(*(coda_type_text **)
                                         (*(long *)(in_FS_OFFSET + -0x118) + 0x70),
                                        (coda_dynamic_type *)0x0,(coda_product *)local_590._8_8_,
                                        &local_5e8);
          uStack_5f0 = 0x12687c;
          coda_mem_record_add_field
                    ((coda_mem_record *)local_590._16_8_,"receiver_type",
                     (coda_dynamic_type *)pcVar21,0);
          uStack_5e0 = CONCAT43(uStack_405,CONCAT12(cStack_406,uStack_408));
          local_5e8 = (char)uStack_410;
          cStack_5e7 = (char)((uint)uStack_410 >> 8);
          cStack_5e6 = (char)((uint)uStack_410 >> 0x10);
          cStack_5e5 = (char)((uint)uStack_410 >> 0x18);
          cStack_5e4 = (char)uStack_40c;
          cStack_5e3 = (char)((uint)uStack_40c >> 8);
          uStack_5e2 = (undefined1)((uint)uStack_40c >> 0x10);
          uStack_5e1 = (undefined1)((uint)uStack_40c >> 0x18);
          cStack_5d9 = cStack_401;
          local_5d8 = (uint5)CONCAT13(uStack_3fd,CONCAT12(cStack_3fe,local_400));
          uStack_5f0 = 0x12689c;
          sVar25 = strlen(&local_5e8);
          if (0 < (long)sVar25) {
            lVar30 = sVar25 + 1;
            do {
              if (*(char *)((long)&uStack_5f0 + lVar30 + 6) != ' ') break;
              *(undefined1 *)((long)&uStack_5f0 + lVar30 + 6) = 0;
              lVar30 = lVar30 + -1;
            } while (1 < lVar30);
          }
          uStack_5f0 = 0x1268d5;
          pcVar21 = coda_mem_string_new(*(coda_type_text **)
                                         (*(long *)(in_FS_OFFSET + -0x118) + 0x78),
                                        (coda_dynamic_type *)0x0,(coda_product *)local_590._8_8_,
                                        &local_5e8);
          pcVar29 = "receiver_version";
          goto LAB_001269c6;
        }
        if (CONCAT11(cStack_3f3,cStack_3f4) == 0x5954 &&
            CONCAT17(cStack_3f5,
                     CONCAT16(cStack_3f6,
                              CONCAT15(cStack_3f7,
                                       CONCAT14(cStack_3f8,
                                                CONCAT13(cStack_3f9,
                                                         CONCAT12(cStack_3fa,
                                                                  CONCAT11(cStack_3fb,local_3fc)))))
                             )) == 0x202f202320544e41) {
          local_5d8 = (uint5)local_428;
          uStack_5f0 = 0x12690c;
          uStack_5d0 = uVar14;
          uStack_5c8 = uVar15;
          uStack_5c0 = uVar16;
          uStack_5bf = uVar17;
          sVar25 = strlen(&local_5e8);
          if (0 < (long)sVar25) {
            lVar30 = sVar25 + 1;
            do {
              if (*(char *)((long)&uStack_5f0 + lVar30 + 6) != ' ') break;
              *(undefined1 *)((long)&uStack_5f0 + lVar30 + 6) = 0;
              lVar30 = lVar30 + -1;
            } while (1 < lVar30);
          }
          uStack_5f0 = 0x126948;
          pcVar21 = coda_mem_string_new(*(coda_type_text **)
                                         (*(long *)(in_FS_OFFSET + -0x118) + 0x80),
                                        (coda_dynamic_type *)0x0,(coda_product *)local_590._8_8_,
                                        &local_5e8);
          uStack_5f0 = 0x12695e;
          coda_mem_record_add_field
                    ((coda_mem_record *)local_590._16_8_,"antenna_number",
                     (coda_dynamic_type *)pcVar21,0);
          local_5e8 = (char)uStack_424;
          cStack_5e7 = (char)(uStack_424 >> 8);
          cStack_5e6 = (char)(uStack_424 >> 0x10);
          cStack_5e5 = (char)(uStack_424 >> 0x18);
          cStack_5e4 = (char)uStack_420;
          cStack_5e3 = (char)((uint)uStack_420 >> 8);
          uStack_5e2 = (undefined1)((uint)uStack_420 >> 0x10);
          uStack_5e1 = (undefined1)((uint)uStack_420 >> 0x18);
          uStack_5e0 = (undefined7)CONCAT44(uStack_418,uStack_41c);
          cStack_5d9 = (char)((uint)uStack_418 >> 0x18);
          local_5d8 = (uint5)uStack_414;
          uStack_5f0 = 0x12697e;
          sVar25 = strlen(&local_5e8);
          if (0 < (long)sVar25) {
            lVar30 = sVar25 + 1;
            do {
              if (*(char *)((long)&uStack_5f0 + lVar30 + 6) != ' ') break;
              *(undefined1 *)((long)&uStack_5f0 + lVar30 + 6) = 0;
              lVar30 = lVar30 + -1;
            } while (1 < lVar30);
          }
          uStack_5f0 = 0x1269ba;
          pcVar21 = coda_mem_string_new(*(coda_type_text **)
                                         (*(long *)(in_FS_OFFSET + -0x118) + 0x88),
                                        (coda_dynamic_type *)0x0,(coda_product *)local_590._8_8_,
                                        &local_5e8);
          pcVar29 = "antenna_type";
          goto LAB_001269c6;
        }
        auVar36[0] = -(local_3fc == 'A');
        auVar36[1] = -(cStack_3fb == 'P');
        auVar36[2] = -(cStack_3fa == 'P');
        auVar36[3] = -(cStack_3f9 == 'R');
        auVar36[4] = -(cStack_3f8 == 'O');
        auVar36[5] = -(cStack_3f7 == 'X');
        auVar36[6] = -(cStack_3f6 == ' ');
        auVar36[7] = -(cStack_3f5 == 'P');
        auVar36[8] = -(cStack_3f4 == 'O');
        auVar36[9] = -(cStack_3f3 == 'S');
        auVar36[10] = -(cStack_3f2 == 'I');
        auVar36[0xb] = -(cStack_3f1 == 'T');
        auVar36[0xc] = -(cStack_3f0 == 'I');
        auVar36[0xd] = -(cStack_3ef == 'O');
        auVar36[0xe] = -(cStack_3ee == 'N');
        auVar36[0xf] = -(cStack_3ed == ' ');
        auVar68[0] = -(cStack_3f9 == 'R');
        auVar68[1] = -(cStack_3f8 == 'O');
        auVar68[2] = -(cStack_3f7 == 'X');
        auVar68[3] = -(cStack_3f6 == ' ');
        auVar68[4] = -(cStack_3f5 == 'P');
        auVar68[5] = -(cStack_3f4 == 'O');
        auVar68[6] = -(cStack_3f3 == 'S');
        auVar68[7] = -(cStack_3f2 == 'I');
        auVar68[8] = -(cStack_3f1 == 'T');
        auVar68[9] = -(cStack_3f0 == 'I');
        auVar68[10] = -(cStack_3ef == 'O');
        auVar68[0xb] = -(cStack_3ee == 'N');
        auVar68[0xc] = -(cStack_3ed == ' ');
        auVar68[0xd] = -(local_3ec == 'X');
        auVar68[0xe] = -(cStack_3eb == 'Y');
        auVar68[0xf] = -(cStack_3ea == 'Z');
        auVar68 = auVar68 & auVar36;
        if ((ushort)((ushort)(SUB161(auVar68 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar68 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar68 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar68 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar68 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar68 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar68 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar68 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar68 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar68 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar68 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar68 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar68 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar68 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar68 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar68[0xf] >> 7) << 0xf) == 0xffff) {
          uStack_5f0 = 0x126a1e;
          local_5e8 = cVar6;
          cStack_5e7 = cVar7;
          cStack_5e6 = cVar8;
          cStack_5e5 = cVar9;
          uStack_5e2 = uVar10;
          uStack_5e1 = uVar11;
          uStack_5e0 = uVar12;
          cStack_5d9 = cVar13;
          uStack_5d0 = uVar14;
          uStack_5c8 = uVar15;
          uStack_5c0 = uVar16;
          uStack_5bf = uVar17;
          lVar20 = coda_ascii_parse_double(local_438,0xe,(double *)&local_5a0,0);
          lVar30 = local_4a0;
          if (lVar20 < 0) goto LAB_00127fd0;
          uStack_5f0 = 0x126a4c;
          pcVar21 = coda_mem_float_new(*(coda_type_number **)
                                        (*(long *)(in_FS_OFFSET + -0x118) + 0x90),
                                       (coda_dynamic_type *)0x0,(coda_product *)local_590._8_8_,
                                       (float)(double)CONCAT44(uStack_59c,local_5a0));
          uStack_5f0 = 0x126a62;
          coda_mem_record_add_field
                    ((coda_mem_record *)local_590._16_8_,"approx_position_x",
                     (coda_dynamic_type *)pcVar21,0);
          uStack_5f0 = 0x126a79;
          lVar30 = coda_ascii_parse_double(acStack_42a,0xe,(double *)&local_5a0,0);
          if (lVar30 < 0) {
LAB_00128287:
            lVar30 = local_4a0 + 0xe;
            goto LAB_00127fd0;
          }
          uStack_5f0 = 0x126aa7;
          pcVar21 = coda_mem_float_new(*(coda_type_number **)
                                        (*(long *)(in_FS_OFFSET + -0x118) + 0x98),
                                       (coda_dynamic_type *)0x0,(coda_product *)local_590._8_8_,
                                       (float)(double)CONCAT44(uStack_59c,local_5a0));
          uStack_5f0 = 0x126abd;
          coda_mem_record_add_field
                    ((coda_mem_record *)local_590._16_8_,"approx_position_y",
                     (coda_dynamic_type *)pcVar21,0);
          uStack_5f0 = 0x126ad4;
          lVar30 = coda_ascii_parse_double((char *)&uStack_41c,0xe,(double *)&local_5a0,0);
          if (lVar30 < 0) {
LAB_001282a0:
            lVar30 = local_4a0 + 0x1c;
            goto LAB_00127fd0;
          }
          uStack_5f0 = 0x126b02;
          pcVar21 = coda_mem_float_new(*(coda_type_number **)
                                        (*(long *)(in_FS_OFFSET + -0x118) + 0xa0),
                                       (coda_dynamic_type *)0x0,(coda_product *)local_590._8_8_,
                                       (float)(double)CONCAT44(uStack_59c,local_5a0));
          pcVar29 = "approx_position_z";
LAB_00126c1d:
          uStack_5f0 = 0x126c27;
          coda_mem_record_add_field
                    ((coda_mem_record *)local_590._16_8_,pcVar29,(coda_dynamic_type *)pcVar21,0);
          cVar6 = local_5e8;
          cVar7 = cStack_5e7;
          cVar8 = cStack_5e6;
          cVar9 = cStack_5e5;
          uVar10 = uStack_5e2;
          uVar11 = uStack_5e1;
          uVar12 = uStack_5e0;
          cVar13 = cStack_5d9;
          uVar14 = uStack_5d0;
          uVar15 = uStack_5c8;
          uVar16 = uStack_5c0;
          uVar17 = uStack_5bf;
          goto LAB_001269d0;
        }
        auVar37[0] = -(local_3fc == 'A');
        auVar37[1] = -(cStack_3fb == 'N');
        auVar37[2] = -(cStack_3fa == 'T');
        auVar37[3] = -(cStack_3f9 == 'E');
        auVar37[4] = -(cStack_3f8 == 'N');
        auVar37[5] = -(cStack_3f7 == 'N');
        auVar37[6] = -(cStack_3f6 == 'A');
        auVar37[7] = -(cStack_3f5 == ':');
        auVar37[8] = -(cStack_3f4 == ' ');
        auVar37[9] = -(cStack_3f3 == 'D');
        auVar37[10] = -(cStack_3f2 == 'E');
        auVar37[0xb] = -(cStack_3f1 == 'L');
        auVar37[0xc] = -(cStack_3f0 == 'T');
        auVar37[0xd] = -(cStack_3ef == 'A');
        auVar37[0xe] = -(cStack_3ee == ' ');
        auVar37[0xf] = -(cStack_3ed == 'H');
        auVar69[0] = -(local_3ec == '/');
        auVar69[1] = -(cStack_3eb == 'E');
        cVar2 = (char)((uint)_local_3ec >> 0x18);
        auVar69[2] = -(cStack_3ea == '/');
        auVar69[3] = -(cVar2 == 'N');
        auVar69[4] = 0xff;
        auVar69[5] = 0xff;
        auVar69[6] = 0xff;
        auVar69[7] = 0xff;
        auVar69[8] = 0xff;
        auVar69[9] = 0xff;
        auVar69[10] = 0xff;
        auVar69[0xb] = 0xff;
        auVar69[0xc] = 0xff;
        auVar69[0xd] = 0xff;
        auVar69[0xe] = 0xff;
        auVar69[0xf] = 0xff;
        auVar69 = auVar69 & auVar37;
        if ((ushort)((ushort)(SUB161(auVar69 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar69 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar69 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar69 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar69 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar69 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar69 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar69 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar69 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar69 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar69 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar69 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar69 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar69 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar69 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar69[0xf] >> 7) << 0xf) == 0xffff) {
          uStack_5f0 = 0x126b2d;
          local_5e8 = cVar6;
          cStack_5e7 = cVar7;
          cStack_5e6 = cVar8;
          cStack_5e5 = cVar9;
          uStack_5e2 = uVar10;
          uStack_5e1 = uVar11;
          uStack_5e0 = uVar12;
          cStack_5d9 = cVar13;
          uStack_5d0 = uVar14;
          uStack_5c8 = uVar15;
          uStack_5c0 = uVar16;
          uStack_5bf = uVar17;
          lVar30 = coda_ascii_parse_double(local_438,0xe,(double *)&local_5a0,0);
          if (-1 < lVar30) {
            uStack_5f0 = 0x126b5b;
            pcVar21 = coda_mem_float_new(*(coda_type_number **)
                                          (*(long *)(in_FS_OFFSET + -0x118) + 0xa8),
                                         (coda_dynamic_type *)0x0,(coda_product *)local_590._8_8_,
                                         (float)(double)CONCAT44(uStack_59c,local_5a0));
            uStack_5f0 = 0x126b71;
            coda_mem_record_add_field
                      ((coda_mem_record *)local_590._16_8_,"antenna_delta_h",
                       (coda_dynamic_type *)pcVar21,0);
            uStack_5f0 = 0x126b88;
            lVar30 = coda_ascii_parse_double(acStack_42a,0xe,(double *)&local_5a0,0);
            if (lVar30 < 0) goto LAB_00128287;
            uStack_5f0 = 0x126bb6;
            pcVar21 = coda_mem_float_new(*(coda_type_number **)
                                          (*(long *)(in_FS_OFFSET + -0x118) + 0xb0),
                                         (coda_dynamic_type *)0x0,(coda_product *)local_590._8_8_,
                                         (float)(double)CONCAT44(uStack_59c,local_5a0));
            uStack_5f0 = 0x126bcc;
            coda_mem_record_add_field
                      ((coda_mem_record *)local_590._16_8_,"antenna_delta_e",
                       (coda_dynamic_type *)pcVar21,0);
            uStack_5f0 = 0x126be3;
            lVar30 = coda_ascii_parse_double((char *)&uStack_41c,0xe,(double *)&local_5a0,0);
            if (lVar30 < 0) goto LAB_001282a0;
            uStack_5f0 = 0x126c11;
            pcVar21 = coda_mem_float_new(*(coda_type_number **)
                                          (*(long *)(in_FS_OFFSET + -0x118) + 0xb8),
                                         (coda_dynamic_type *)0x0,(coda_product *)local_590._8_8_,
                                         (float)(double)CONCAT44(uStack_59c,local_5a0));
            pcVar29 = "antenna_delta_n";
            goto LAB_00126c1d;
          }
          uStack_5f0 = 0x1282dc;
          coda_add_error_message
                    (" (line: %ld, byte offset: %ld)",local_4a8,local_590._8_8_,local_4a0);
          goto LAB_00125a89;
        }
        auVar38[0] = -(local_3fc == 'A');
        auVar38[1] = -(cStack_3fb == 'N');
        auVar38[2] = -(cStack_3fa == 'T');
        auVar38[3] = -(cStack_3f9 == 'E');
        auVar38[4] = -(cStack_3f8 == 'N');
        auVar38[5] = -(cStack_3f7 == 'N');
        auVar38[6] = -(cStack_3f6 == 'A');
        auVar38[7] = -(cStack_3f5 == ':');
        auVar38[8] = -(cStack_3f4 == ' ');
        auVar38[9] = -(cStack_3f3 == 'D');
        auVar38[10] = -(cStack_3f2 == 'E');
        auVar38[0xb] = -(cStack_3f1 == 'L');
        auVar38[0xc] = -(cStack_3f0 == 'T');
        auVar38[0xd] = -(cStack_3ef == 'A');
        auVar38[0xe] = -(cStack_3ee == ' ');
        auVar38[0xf] = -(cStack_3ed == 'X');
        auVar70[0] = -(local_3ec == '/');
        auVar70[1] = -(cStack_3eb == 'Y');
        auVar70[2] = -(cStack_3ea == '/');
        auVar70[3] = -(cVar2 == 'Z');
        auVar70[4] = 0xff;
        auVar70[5] = 0xff;
        auVar70[6] = 0xff;
        auVar70[7] = 0xff;
        auVar70[8] = 0xff;
        auVar70[9] = 0xff;
        auVar70[10] = 0xff;
        auVar70[0xb] = 0xff;
        auVar70[0xc] = 0xff;
        auVar70[0xd] = 0xff;
        auVar70[0xe] = 0xff;
        auVar70[0xf] = 0xff;
        auVar70 = auVar70 & auVar38;
        if ((((ushort)((ushort)(SUB161(auVar70 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar70 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar70 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar70 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar70 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar70 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar70 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar70 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar70 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar70 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar70 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar70 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar70 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar70 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar70 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar70[0xf] >> 7) << 0xf) == 0xffff) ||
            (auVar39[0] = -(local_3fc == 'A'), auVar39[1] = -(cStack_3fb == 'N'),
            auVar39[2] = -(cStack_3fa == 'T'), auVar39[3] = -(cStack_3f9 == 'E'),
            auVar39[4] = -(cStack_3f8 == 'N'), auVar39[5] = -(cStack_3f7 == 'N'),
            auVar39[6] = -(cStack_3f6 == 'A'), auVar39[7] = -(cStack_3f5 == ':'),
            auVar39[8] = -(cStack_3f4 == ' '), auVar39[9] = -(cStack_3f3 == 'P'),
            auVar39[10] = -(cStack_3f2 == 'H'), auVar39[0xb] = -(cStack_3f1 == 'A'),
            auVar39[0xc] = -(cStack_3f0 == 'S'), auVar39[0xd] = -(cStack_3ef == 'E'),
            auVar39[0xe] = -(cStack_3ee == 'C'), auVar39[0xf] = -(cStack_3ed == 'E'),
            auVar71[0] = -(local_3ec == 'N'), auVar71[1] = -(cStack_3eb == 'T'),
            auVar71[2] = -(cStack_3ea == 'E'), auVar71[3] = -(cVar2 == 'R'), auVar71[4] = 0xff,
            auVar71[5] = 0xff, auVar71[6] = 0xff, auVar71[7] = 0xff, auVar71[8] = 0xff,
            auVar71[9] = 0xff, auVar71[10] = 0xff, auVar71[0xb] = 0xff, auVar71[0xc] = 0xff,
            auVar71[0xd] = 0xff, auVar71[0xe] = 0xff, auVar71[0xf] = 0xff,
            auVar71 = auVar71 & auVar39,
            (ushort)((ushort)(SUB161(auVar71 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar71 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar71 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar71 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar71 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar71 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar71 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar71 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar71 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar71 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar71 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar71 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar71 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar71 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar71 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar71[0xf] >> 7) << 0xf) == 0xffff)) ||
           (((auVar40[0] = -(local_3fc == 'A'), auVar40[1] = -(cStack_3fb == 'N'),
             auVar40[2] = -(cStack_3fa == 'T'), auVar40[3] = -(cStack_3f9 == 'E'),
             auVar40[4] = -(cStack_3f8 == 'N'), auVar40[5] = -(cStack_3f7 == 'N'),
             auVar40[6] = -(cStack_3f6 == 'A'), auVar40[7] = -(cStack_3f5 == ':'),
             auVar40[8] = -(cStack_3f4 == ' '), auVar40[9] = -(cStack_3f3 == 'B'),
             auVar40[10] = -(cStack_3f2 == '.'), auVar40[0xb] = -(cStack_3f1 == 'S'),
             auVar40[0xc] = -(cStack_3f0 == 'I'), auVar40[0xd] = -(cStack_3ef == 'G'),
             auVar40[0xe] = -(cStack_3ee == 'H'), auVar40[0xf] = -(cStack_3ed == 'T'),
             auVar72[0] = -(local_3ec == ' '), auVar72[1] = -(cStack_3eb == 'X'),
             auVar72[2] = -(cStack_3ea == 'Y'), auVar72[3] = -(cVar2 == 'Z'), auVar72[4] = 0xff,
             auVar72[5] = 0xff, auVar72[6] = 0xff, auVar72[7] = 0xff, auVar72[8] = 0xff,
             auVar72[9] = 0xff, auVar72[10] = 0xff, auVar72[0xb] = 0xff, auVar72[0xc] = 0xff,
             auVar72[0xd] = 0xff, auVar72[0xe] = 0xff, auVar72[0xf] = 0xff,
             auVar72 = auVar72 & auVar40,
             (ushort)((ushort)(SUB161(auVar72 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar72 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB161(auVar72 >> 0x17,0) & 1) << 2 |
                      (ushort)(SUB161(auVar72 >> 0x1f,0) & 1) << 3 |
                      (ushort)(SUB161(auVar72 >> 0x27,0) & 1) << 4 |
                      (ushort)(SUB161(auVar72 >> 0x2f,0) & 1) << 5 |
                      (ushort)(SUB161(auVar72 >> 0x37,0) & 1) << 6 |
                      (ushort)(SUB161(auVar72 >> 0x3f,0) & 1) << 7 |
                      (ushort)(SUB161(auVar72 >> 0x47,0) & 1) << 8 |
                      (ushort)(SUB161(auVar72 >> 0x4f,0) & 1) << 9 |
                      (ushort)(SUB161(auVar72 >> 0x57,0) & 1) << 10 |
                      (ushort)(SUB161(auVar72 >> 0x5f,0) & 1) << 0xb |
                      (ushort)(SUB161(auVar72 >> 0x67,0) & 1) << 0xc |
                      (ushort)(SUB161(auVar72 >> 0x6f,0) & 1) << 0xd |
                      (ushort)(SUB161(auVar72 >> 0x77,0) & 1) << 0xe |
                     (ushort)(byte)(auVar72[0xf] >> 7) << 0xf) == 0xffff ||
             ((auVar41[0] = -(local_3fc == 'A'), auVar41[1] = -(cStack_3fb == 'N'),
              auVar41[2] = -(cStack_3fa == 'T'), auVar41[3] = -(cStack_3f9 == 'E'),
              auVar41[4] = -(cStack_3f8 == 'N'), auVar41[5] = -(cStack_3f7 == 'N'),
              auVar41[6] = -(cStack_3f6 == 'A'), auVar41[7] = -(cStack_3f5 == ':'),
              auVar41[8] = -(cStack_3f4 == ' '), auVar41[9] = -(cStack_3f3 == 'Z'),
              auVar41[10] = -(cStack_3f2 == 'E'), auVar41[0xb] = -(cStack_3f1 == 'R'),
              auVar41[0xc] = -(cStack_3f0 == 'O'), auVar41[0xd] = -(cStack_3ef == 'D'),
              auVar41[0xe] = -(cStack_3ee == 'I'), auVar41[0xf] = -(cStack_3ed == 'R'),
              auVar73[0] = -(local_3ec == ' '), auVar73[1] = -(cStack_3eb == 'A'),
              auVar73[2] = -(cStack_3ea == 'Z'), auVar73[3] = -(cVar2 == 'I'), auVar73[4] = 0xff,
              auVar73[5] = 0xff, auVar73[6] = 0xff, auVar73[7] = 0xff, auVar73[8] = 0xff,
              auVar73[9] = 0xff, auVar73[10] = 0xff, auVar73[0xb] = 0xff, auVar73[0xc] = 0xff,
              auVar73[0xd] = 0xff, auVar73[0xe] = 0xff, auVar73[0xf] = 0xff,
              auVar73 = auVar73 & auVar41,
              (ushort)((ushort)(SUB161(auVar73 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar73 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar73 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar73 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar73 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar73 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar73 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar73 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar73 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar73 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar73 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar73 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar73 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar73 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar73 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar73[0xf] >> 7) << 0xf) == 0xffff ||
              (auVar74[0] = -(local_3fc == 'A'), auVar74[1] = -(cStack_3fb == 'N'),
              auVar74[2] = -(cStack_3fa == 'T'), auVar74[3] = -(cStack_3f9 == 'E'),
              auVar74[4] = -(cStack_3f8 == 'N'), auVar74[5] = -(cStack_3f7 == 'N'),
              auVar74[6] = -(cStack_3f6 == 'A'), auVar74[7] = -(cStack_3f5 == ':'),
              auVar74[8] = -(cStack_3f4 == ' '), auVar74[9] = -(cStack_3f3 == 'Z'),
              auVar74[10] = -(cStack_3f2 == 'E'), auVar74[0xb] = -(cStack_3f1 == 'R'),
              auVar74[0xc] = -(cStack_3f0 == 'O'), auVar74[0xd] = -(cStack_3ef == 'D'),
              auVar74[0xe] = -(cStack_3ee == 'I'), auVar74[0xf] = -(cStack_3ed == 'R'),
              auVar42[0] = -(local_3ec == ' '), auVar42[1] = -(cStack_3eb == 'X'),
              auVar42[2] = -(cStack_3ea == 'Y'), auVar42[3] = -(cVar2 == 'Z'), auVar42[4] = 0xff,
              auVar42[5] = 0xff, auVar42[6] = 0xff, auVar42[7] = 0xff, auVar42[8] = 0xff,
              auVar42[9] = 0xff, auVar42[10] = 0xff, auVar42[0xb] = 0xff, auVar42[0xc] = 0xff,
              auVar42[0xd] = 0xff, auVar42[0xe] = 0xff, auVar42[0xf] = 0xff,
              auVar42 = auVar42 & auVar74,
              (ushort)((ushort)(SUB161(auVar42 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar42 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar42 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar42 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar42 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar42 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar42 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar42 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar42 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar42 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar42 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar42 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar42 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar42 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar42 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar42[0xf] >> 7) << 0xf) == 0xffff)))) ||
            (auVar43[0] = -(local_3fc == 'C'), auVar43[1] = -(cStack_3fb == 'E'),
            auVar43[2] = -(cStack_3fa == 'N'), auVar43[3] = -(cStack_3f9 == 'T'),
            auVar43[4] = -(cStack_3f8 == 'E'), auVar43[5] = -(cStack_3f7 == 'R'),
            auVar43[6] = -(cStack_3f6 == ' '), auVar43[7] = -(cStack_3f5 == 'O'),
            auVar43[8] = -(cStack_3f4 == 'F'), auVar43[9] = -(cStack_3f3 == ' '),
            auVar43[10] = -(cStack_3f2 == 'M'), auVar43[0xb] = -(cStack_3f1 == 'A'),
            auVar43[0xc] = -(cStack_3f0 == 'S'), auVar43[0xd] = -(cStack_3ef == 'S'),
            auVar43[0xe] = -(cStack_3ee == ':'), auVar43[0xf] = -(cStack_3ed == ' '),
            auVar75[0] = -(cStack_3f9 == 'T'), auVar75[1] = -(cStack_3f8 == 'E'),
            auVar75[2] = -(cStack_3f7 == 'R'), auVar75[3] = -(cStack_3f6 == ' '),
            auVar75[4] = -(cStack_3f5 == 'O'), auVar75[5] = -(cStack_3f4 == 'F'),
            auVar75[6] = -(cStack_3f3 == ' '), auVar75[7] = -(cStack_3f2 == 'M'),
            auVar75[8] = -(cStack_3f1 == 'A'), auVar75[9] = -(cStack_3f0 == 'S'),
            auVar75[10] = -(cStack_3ef == 'S'), auVar75[0xb] = -(cStack_3ee == ':'),
            auVar75[0xc] = -(cStack_3ed == ' '), auVar75[0xd] = -(local_3ec == 'X'),
            auVar75[0xe] = -(cStack_3eb == 'Y'), auVar75[0xf] = -(cStack_3ea == 'Z'),
            auVar75 = auVar75 & auVar43,
            (ushort)((ushort)(SUB161(auVar75 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar75 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar75 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar75 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar75 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar75 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar75 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar75 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar75 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar75 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar75 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar75 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar75 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar75 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar75 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar75[0xf] >> 7) << 0xf) == 0xffff)))) goto LAB_001269d0;
        auVar44[0] = -(local_3fc == 'S');
        auVar44[1] = -(cStack_3fb == 'Y');
        auVar44[2] = -(cStack_3fa == 'S');
        auVar44[3] = -(cStack_3f9 == ' ');
        auVar44[4] = -(cStack_3f8 == '/');
        auVar44[5] = -(cStack_3f7 == ' ');
        auVar44[6] = -(cStack_3f6 == '#');
        auVar44[7] = -(cStack_3f5 == ' ');
        auVar44[8] = -(cStack_3f4 == '/');
        auVar44[9] = -(cStack_3f3 == ' ');
        auVar44[10] = -(cStack_3f2 == 'O');
        auVar44[0xb] = -(cStack_3f1 == 'B');
        auVar44[0xc] = -(cStack_3f0 == 'S');
        auVar44[0xd] = -(cStack_3ef == ' ');
        auVar44[0xe] = -(cStack_3ee == 'T');
        auVar44[0xf] = -(cStack_3ed == 'Y');
        auVar76[0] = -(cStack_3f9 == ' ');
        auVar76[1] = -(cStack_3f8 == '/');
        auVar76[2] = -(cStack_3f7 == ' ');
        auVar76[3] = -(cStack_3f6 == '#');
        auVar76[4] = -(cStack_3f5 == ' ');
        auVar76[5] = -(cStack_3f4 == '/');
        auVar76[6] = -(cStack_3f3 == ' ');
        auVar76[7] = -(cStack_3f2 == 'O');
        auVar76[8] = -(cStack_3f1 == 'B');
        auVar76[9] = -(cStack_3f0 == 'S');
        auVar76[10] = -(cStack_3ef == ' ');
        auVar76[0xb] = -(cStack_3ee == 'T');
        auVar76[0xc] = -(cStack_3ed == 'Y');
        auVar76[0xd] = -(local_3ec == 'P');
        auVar76[0xe] = -(cStack_3eb == 'E');
        auVar76[0xf] = -(cStack_3ea == 'S');
        auVar76 = auVar76 & auVar44;
        if ((ushort)((ushort)(SUB161(auVar76 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar76 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar76 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar76 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar76 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar76 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar76 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar76 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar76 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar76 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar76 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar76 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar76 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar76 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar76 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar76[0xf] >> 7) << 0xf) == 0xffff) {
          uStack_5f0 = 0x126c3e;
          local_5e8 = cVar6;
          cStack_5e7 = cVar7;
          cStack_5e6 = cVar8;
          cStack_5e5 = cVar9;
          uStack_5e2 = uVar10;
          uStack_5e1 = uVar11;
          uStack_5e0 = uVar12;
          cStack_5d9 = cVar13;
          uStack_5d0 = uVar14;
          uStack_5c8 = uVar15;
          uStack_5c0 = uVar16;
          uStack_5bf = uVar17;
          iVar19 = handle_observation_definition((ingest_info *)local_590,local_438);
          cVar6 = local_5e8;
          cVar7 = cStack_5e7;
          cVar8 = cStack_5e6;
          cVar9 = cStack_5e5;
          uVar10 = uStack_5e2;
          uVar11 = uStack_5e1;
          uVar12 = uStack_5e0;
          cVar13 = cStack_5d9;
          uVar14 = uStack_5d0;
          uVar15 = uStack_5c8;
          uVar16 = uStack_5c0;
          uVar17 = uStack_5bf;
          if (iVar19 != 0) goto LAB_00125a89;
          goto LAB_001269d0;
        }
        auVar45[0] = -(local_3fc == 'S');
        auVar45[1] = -(cStack_3fb == 'I');
        auVar45[2] = -(cStack_3fa == 'G');
        auVar45[3] = -(cStack_3f9 == 'N');
        auVar45[4] = -(cStack_3f8 == 'A');
        auVar45[5] = -(cStack_3f7 == 'L');
        auVar45[6] = -(cStack_3f6 == ' ');
        auVar45[7] = -(cStack_3f5 == 'S');
        auVar45[8] = -(cStack_3f4 == 'T');
        auVar45[9] = -(cStack_3f3 == 'R');
        auVar45[10] = -(cStack_3f2 == 'E');
        auVar45[0xb] = -(cStack_3f1 == 'N');
        auVar45[0xc] = -(cStack_3f0 == 'G');
        auVar45[0xd] = -(cStack_3ef == 'T');
        auVar45[0xe] = -(cStack_3ee == 'H');
        auVar45[0xf] = -(cStack_3ed == ' ');
        auVar77[0] = -(local_3ec == 'U');
        auVar77[1] = -(cStack_3eb == 'N');
        auVar77[2] = -(cStack_3ea == 'I');
        auVar77[3] = -(cVar2 == 'T');
        auVar77[4] = 0xff;
        auVar77[5] = 0xff;
        auVar77[6] = 0xff;
        auVar77[7] = 0xff;
        auVar77[8] = 0xff;
        auVar77[9] = 0xff;
        auVar77[10] = 0xff;
        auVar77[0xb] = 0xff;
        auVar77[0xc] = 0xff;
        auVar77[0xd] = 0xff;
        auVar77[0xe] = 0xff;
        auVar77[0xf] = 0xff;
        auVar77 = auVar77 & auVar45;
        if ((ushort)((ushort)(SUB161(auVar77 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar77 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar77 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar77 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar77 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar77 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar77 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar77 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar77 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar77 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar77 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar77 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar77 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar77 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar77 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar77[0xf] >> 7) << 0xf) == 0xffff) {
          cStack_5e4 = cStack_434;
          cStack_5e3 = acStack_433[0];
          local_5d8 = (uint5)local_428;
          uStack_5f0 = 0x126c80;
          uStack_5d0 = uVar14;
          uStack_5c8 = uVar15;
          uStack_5c0 = uVar16;
          uStack_5bf = uVar17;
          rtrim(&local_5e8);
          uStack_5f0 = 0x126c9f;
          pcVar21 = coda_mem_string_new(*(coda_type_text **)
                                         (*(long *)(in_FS_OFFSET + -0x118) + 0x108),
                                        (coda_dynamic_type *)0x0,(coda_product *)local_590._8_8_,
                                        &local_5e8);
          pcVar29 = "signal_strength_unit";
        }
        else if (CONCAT17(cStack_3f5,
                          CONCAT16(cStack_3f6,
                                   CONCAT15(cStack_3f7,
                                            CONCAT14(cStack_3f8,
                                                     CONCAT13(cStack_3f9,
                                                              CONCAT12(cStack_3fa,
                                                                       CONCAT11(cStack_3fb,local_3fc
                                                                               ))))))) ==
                 0x4c41565245544e49) {
          uStack_5f0 = 0x126cc4;
          local_5e8 = cVar6;
          cStack_5e7 = cVar7;
          cStack_5e6 = cVar8;
          cStack_5e5 = cVar9;
          uStack_5e2 = uVar10;
          uStack_5e1 = uVar11;
          uStack_5e0 = uVar12;
          cStack_5d9 = cVar13;
          uStack_5d0 = uVar14;
          uStack_5c8 = uVar15;
          uStack_5c0 = uVar16;
          uStack_5bf = uVar17;
          lVar20 = coda_ascii_parse_double(local_438,10,(double *)&local_5a0,0);
          lVar30 = local_4a0;
          if (lVar20 < 0) goto LAB_00127fd0;
          uStack_5f0 = 0x126cef;
          pcVar21 = coda_mem_double_new(*(coda_type_number **)
                                         (*(long *)(in_FS_OFFSET + -0x118) + 0x110),
                                        (coda_dynamic_type *)0x0,(coda_product *)local_590._8_8_,
                                        (double)CONCAT44(uStack_59c,local_5a0));
          pcVar29 = "obs_interval";
        }
        else {
          auVar46[0] = -(local_3fc == 'T');
          auVar46[1] = -(cStack_3fb == 'I');
          auVar46[2] = -(cStack_3fa == 'M');
          auVar46[3] = -(cStack_3f9 == 'E');
          auVar46[4] = -(cStack_3f8 == ' ');
          auVar46[5] = -(cStack_3f7 == 'O');
          auVar46[6] = -(cStack_3f6 == 'F');
          auVar46[7] = -(cStack_3f5 == ' ');
          auVar46[8] = -(cStack_3f4 == 'F');
          auVar46[9] = -(cStack_3f3 == 'I');
          auVar46[10] = -(cStack_3f2 == 'R');
          auVar46[0xb] = -(cStack_3f1 == 'S');
          auVar46[0xc] = -(cStack_3f0 == 'T');
          auVar46[0xd] = -(cStack_3ef == ' ');
          auVar46[0xe] = -(cStack_3ee == 'O');
          auVar46[0xf] = -(cStack_3ed == 'B');
          auVar78[0] = -(local_3ec == 'S');
          auVar78[1] = 0xff;
          auVar78[2] = 0xff;
          auVar78[3] = 0xff;
          auVar78[4] = 0xff;
          auVar78[5] = 0xff;
          auVar78[6] = 0xff;
          auVar78[7] = 0xff;
          auVar78[8] = 0xff;
          auVar78[9] = 0xff;
          auVar78[10] = 0xff;
          auVar78[0xb] = 0xff;
          auVar78[0xc] = 0xff;
          auVar78[0xd] = 0xff;
          auVar78[0xe] = 0xff;
          auVar78[0xf] = 0xff;
          auVar78 = auVar78 & auVar46;
          if ((ushort)((ushort)(SUB161(auVar78 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar78 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar78 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar78 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar78 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar78 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar78 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar78 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar78 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar78 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar78 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar78 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar78 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar78 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar78 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar78[0xf] >> 7) << 0xf) == 0xffff) {
            uStack_5c5 = CONCAT41(uStack_414,uStack_418._3_1_);
            _local_5d8 = CONCAT44(uStack_424,local_428);
            uStack_5cd = (undefined5)(CONCAT44(uStack_41c,uStack_420) >> 0x18);
            cStack_5e4 = cStack_434;
            cStack_5e3 = acStack_433[0];
            uStack_5bd = 0;
            uStack_5f0 = 0x126d51;
            pcVar21 = coda_mem_string_new(*(coda_type_text **)
                                           (*(long *)(in_FS_OFFSET + -0x118) + 0x120),
                                          (coda_dynamic_type *)0x0,(coda_product *)local_590._8_8_,
                                          &local_5e8);
            uStack_5f0 = 0x126d6b;
            pcVar26 = coda_mem_time_new(*(coda_type_special **)
                                         (*(long *)(in_FS_OFFSET + -0x118) + 0x118),
                                        (coda_dynamic_type *)0x0,(coda_dynamic_type *)pcVar21);
            uStack_5f0 = 0x126d81;
            coda_mem_record_add_field
                      ((coda_mem_record *)local_590._16_8_,"time_of_first_obs",
                       (coda_dynamic_type *)pcVar26,0);
            local_5e8 = (char)uStack_408;
            cStack_5e7 = (char)((ushort)uStack_408 >> 8);
            cStack_5e6 = cStack_406;
            if (CONCAT12(cStack_406,uStack_408) == 0x202020) {
              if (cStack_4af == 'E') {
                local_5e8 = 'G';
                cStack_5e7 = 'A';
                cStack_5e6 = 'L';
              }
              else if (cStack_4af == 'R') {
                local_5e8 = 'G';
                cStack_5e7 = 'L';
                cStack_5e6 = 'O';
              }
              else if (cStack_4af == 'G') {
                local_5e8 = 'G';
                cStack_5e7 = 'P';
                cStack_5e6 = 'S';
              }
            }
            cStack_5e5 = 0;
            uStack_5f0 = 0x126f21;
            pcVar21 = coda_mem_string_new(*(coda_type_text **)
                                           (*(long *)(in_FS_OFFSET + -0x118) + 0x138),
                                          (coda_dynamic_type *)0x0,(coda_product *)local_590._8_8_,
                                          &local_5e8);
            pcVar29 = "time_of_first_obs_time_zone";
          }
          else {
            auVar47[0] = -(local_3fc == 'T');
            auVar47[1] = -(cStack_3fb == 'I');
            auVar47[2] = -(cStack_3fa == 'M');
            auVar47[3] = -(cStack_3f9 == 'E');
            auVar47[4] = -(cStack_3f8 == ' ');
            auVar47[5] = -(cStack_3f7 == 'O');
            auVar47[6] = -(cStack_3f6 == 'F');
            auVar47[7] = -(cStack_3f5 == ' ');
            auVar47[8] = -(cStack_3f4 == 'L');
            auVar47[9] = -(cStack_3f3 == 'A');
            auVar47[10] = -(cStack_3f2 == 'S');
            auVar47[0xb] = -(cStack_3f1 == 'T');
            auVar47[0xc] = -(cStack_3f0 == ' ');
            auVar47[0xd] = -(cStack_3ef == 'O');
            auVar47[0xe] = -(cStack_3ee == 'B');
            auVar47[0xf] = -(cStack_3ed == 'S');
            if ((ushort)((ushort)(SUB161(auVar47 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar47 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar47 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar47 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar47 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar47 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar47 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar47 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar47 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar47 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar47 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar47 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar47 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar47 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar47 >> 0x77,0) & 1) << 0xe |
                        (ushort)(auVar47[0xf] >> 7) << 0xf) == 0xffff) {
              uStack_5c5 = CONCAT41(uStack_414,uStack_418._3_1_);
              _local_5d8 = CONCAT44(uStack_424,local_428);
              uStack_5cd = (undefined5)(CONCAT44(uStack_41c,uStack_420) >> 0x18);
              cStack_5e4 = cStack_434;
              cStack_5e3 = acStack_433[0];
              uStack_5bd = 0;
              uStack_5f0 = 0x126e24;
              pcVar21 = coda_mem_string_new(*(coda_type_text **)
                                             (*(long *)(in_FS_OFFSET + -0x118) + 0x130),
                                            (coda_dynamic_type *)0x0,(coda_product *)local_590._8_8_
                                            ,&local_5e8);
              uStack_5f0 = 0x126e3e;
              pcVar26 = coda_mem_time_new(*(coda_type_special **)
                                           (*(long *)(in_FS_OFFSET + -0x118) + 0x128),
                                          (coda_dynamic_type *)0x0,(coda_dynamic_type *)pcVar21);
              uStack_5f0 = 0x126e54;
              coda_mem_record_add_field
                        ((coda_mem_record *)local_590._16_8_,"time_of_last_obs",
                         (coda_dynamic_type *)pcVar26,0);
              local_5e8 = (char)uStack_408;
              cStack_5e7 = (char)((ushort)uStack_408 >> 8);
              cStack_5e6 = cStack_406;
              if (CONCAT12(cStack_406,uStack_408) == 0x202020) {
                if (cStack_4af == 'E') {
                  local_5e8 = 'G';
                  cStack_5e7 = 'A';
                  cStack_5e6 = 'L';
                }
                else if (cStack_4af == 'R') {
                  local_5e8 = 'G';
                  cStack_5e7 = 'L';
                  cStack_5e6 = 'O';
                }
                else if (cStack_4af == 'G') {
                  local_5e8 = 'G';
                  cStack_5e7 = 'P';
                  cStack_5e6 = 'S';
                }
              }
              cStack_5e5 = 0;
              uStack_5f0 = 0x126f5e;
              pcVar21 = coda_mem_string_new(*(coda_type_text **)
                                             (*(long *)(in_FS_OFFSET + -0x118) + 0x138),
                                            (coda_dynamic_type *)0x0,(coda_product *)local_590._8_8_
                                            ,&local_5e8);
              pcVar29 = "time_of_last_obs_time_zone";
            }
            else {
              auVar48[0] = -(local_3fc == 'R');
              auVar48[1] = -(cStack_3fb == 'C');
              auVar48[2] = -(cStack_3fa == 'V');
              auVar48[3] = -(cStack_3f9 == ' ');
              auVar48[4] = -(cStack_3f8 == 'C');
              auVar48[5] = -(cStack_3f7 == 'L');
              auVar48[6] = -(cStack_3f6 == 'O');
              auVar48[7] = -(cStack_3f5 == 'C');
              auVar48[8] = -(cStack_3f4 == 'K');
              auVar48[9] = -(cStack_3f3 == ' ');
              auVar48[10] = -(cStack_3f2 == 'O');
              auVar48[0xb] = -(cStack_3f1 == 'F');
              auVar48[0xc] = -(cStack_3f0 == 'F');
              auVar48[0xd] = -(cStack_3ef == 'S');
              auVar48[0xe] = -(cStack_3ee == ' ');
              auVar48[0xf] = -(cStack_3ed == 'A');
              auVar79[0] = -(cStack_3f9 == ' ');
              auVar79[1] = -(cStack_3f8 == 'C');
              auVar79[2] = -(cStack_3f7 == 'L');
              auVar79[3] = -(cStack_3f6 == 'O');
              auVar79[4] = -(cStack_3f5 == 'C');
              auVar79[5] = -(cStack_3f4 == 'K');
              auVar79[6] = -(cStack_3f3 == ' ');
              auVar79[7] = -(cStack_3f2 == 'O');
              auVar79[8] = -(cStack_3f1 == 'F');
              auVar79[9] = -(cStack_3f0 == 'F');
              auVar79[10] = -(cStack_3ef == 'S');
              auVar79[0xb] = -(cStack_3ee == ' ');
              auVar79[0xc] = -(cStack_3ed == 'A');
              auVar79[0xd] = -(local_3ec == 'P');
              auVar79[0xe] = -(cStack_3eb == 'P');
              auVar79[0xf] = -(cStack_3ea == 'L');
              auVar79 = auVar79 & auVar48;
              if ((ushort)((ushort)(SUB161(auVar79 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar79 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar79 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar79 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar79 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar79 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar79 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar79 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar79 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar79 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar79 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar79 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar79 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar79 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar79 >> 0x77,0) & 1) << 0xe |
                          (ushort)(byte)(auVar79[0xf] >> 7) << 0xf) == 0xffff) {
                uStack_5f0 = 0x126eba;
                local_5e8 = cVar6;
                cStack_5e7 = cVar7;
                cStack_5e6 = cVar8;
                cStack_5e5 = cVar9;
                uStack_5e2 = uVar10;
                uStack_5e1 = uVar11;
                uStack_5e0 = uVar12;
                cStack_5d9 = cVar13;
                uStack_5d0 = uVar14;
                uStack_5c8 = uVar15;
                uStack_5c0 = uVar16;
                uStack_5bf = uVar17;
                lVar20 = coda_ascii_parse_int64(local_438,6,(int64_t *)local_598,0);
                lVar30 = local_4a0;
                if (lVar20 < 0) goto LAB_00127fd0;
                uStack_5f0 = 0x126ee4;
                pcVar21 = coda_mem_uint8_new(*(coda_type_number **)
                                              (*(long *)(in_FS_OFFSET + -0x118) + 0x140),
                                             (coda_dynamic_type *)0x0,
                                             (coda_product *)local_590._8_8_,(uint8_t)local_598[0]);
                pcVar29 = "rcv_clock_offs_appl";
              }
              else {
                auVar49[0] = -(local_3fc == 'S');
                auVar49[1] = -(cStack_3fb == 'Y');
                auVar49[2] = -(cStack_3fa == 'S');
                auVar49[3] = -(cStack_3f9 == ' ');
                auVar49[4] = -(cStack_3f8 == '/');
                auVar49[5] = -(cStack_3f7 == ' ');
                auVar49[6] = -(cStack_3f6 == 'D');
                auVar49[7] = -(cStack_3f5 == 'C');
                auVar49[8] = -(cStack_3f4 == 'B');
                auVar49[9] = -(cStack_3f3 == 'S');
                auVar49[10] = -(cStack_3f2 == ' ');
                auVar49[0xb] = -(cStack_3f1 == 'A');
                auVar49[0xc] = -(cStack_3f0 == 'P');
                auVar49[0xd] = -(cStack_3ef == 'P');
                auVar49[0xe] = -(cStack_3ee == 'L');
                auVar49[0xf] = -(cStack_3ed == 'I');
                auVar80[0] = -(local_3ec == 'E');
                auVar80[1] = -(cStack_3eb == 'D');
                auVar80[2] = 0xff;
                auVar80[3] = 0xff;
                auVar80[4] = 0xff;
                auVar80[5] = 0xff;
                auVar80[6] = 0xff;
                auVar80[7] = 0xff;
                auVar80[8] = 0xff;
                auVar80[9] = 0xff;
                auVar80[10] = 0xff;
                auVar80[0xb] = 0xff;
                auVar80[0xc] = 0xff;
                auVar80[0xd] = 0xff;
                auVar80[0xe] = 0xff;
                auVar80[0xf] = 0xff;
                auVar80 = auVar80 & auVar49;
                if ((((ushort)((ushort)(SUB161(auVar80 >> 7,0) & 1) |
                               (ushort)(SUB161(auVar80 >> 0xf,0) & 1) << 1 |
                               (ushort)(SUB161(auVar80 >> 0x17,0) & 1) << 2 |
                               (ushort)(SUB161(auVar80 >> 0x1f,0) & 1) << 3 |
                               (ushort)(SUB161(auVar80 >> 0x27,0) & 1) << 4 |
                               (ushort)(SUB161(auVar80 >> 0x2f,0) & 1) << 5 |
                               (ushort)(SUB161(auVar80 >> 0x37,0) & 1) << 6 |
                               (ushort)(SUB161(auVar80 >> 0x3f,0) & 1) << 7 |
                               (ushort)(SUB161(auVar80 >> 0x47,0) & 1) << 8 |
                               (ushort)(SUB161(auVar80 >> 0x4f,0) & 1) << 9 |
                               (ushort)(SUB161(auVar80 >> 0x57,0) & 1) << 10 |
                               (ushort)(SUB161(auVar80 >> 0x5f,0) & 1) << 0xb |
                               (ushort)(SUB161(auVar80 >> 0x67,0) & 1) << 0xc |
                               (ushort)(SUB161(auVar80 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar80 >> 0x77,0) & 1) << 0xe |
                              (ushort)(byte)(auVar80[0xf] >> 7) << 0xf) == 0xffff) ||
                    (auVar50[0] = -(local_3fc == 'S'), auVar50[1] = -(cStack_3fb == 'Y'),
                    auVar50[2] = -(cStack_3fa == 'S'), auVar50[3] = -(cStack_3f9 == ' '),
                    auVar50[4] = -(cStack_3f8 == '/'), auVar50[5] = -(cStack_3f7 == ' '),
                    auVar50[6] = -(cStack_3f6 == 'P'), auVar50[7] = -(cStack_3f5 == 'C'),
                    auVar50[8] = -(cStack_3f4 == 'V'), auVar50[9] = -(cStack_3f3 == 'S'),
                    auVar50[10] = -(cStack_3f2 == ' '), auVar50[0xb] = -(cStack_3f1 == 'A'),
                    auVar50[0xc] = -(cStack_3f0 == 'P'), auVar50[0xd] = -(cStack_3ef == 'P'),
                    auVar50[0xe] = -(cStack_3ee == 'L'), auVar50[0xf] = -(cStack_3ed == 'I'),
                    auVar81[0] = -(local_3ec == 'E'), auVar81[1] = -(cStack_3eb == 'D'),
                    auVar81[2] = 0xff, auVar81[3] = 0xff, auVar81[4] = 0xff, auVar81[5] = 0xff,
                    auVar81[6] = 0xff, auVar81[7] = 0xff, auVar81[8] = 0xff, auVar81[9] = 0xff,
                    auVar81[10] = 0xff, auVar81[0xb] = 0xff, auVar81[0xc] = 0xff,
                    auVar81[0xd] = 0xff, auVar81[0xe] = 0xff, auVar81[0xf] = 0xff,
                    auVar81 = auVar81 & auVar50,
                    (ushort)((ushort)(SUB161(auVar81 >> 7,0) & 1) |
                             (ushort)(SUB161(auVar81 >> 0xf,0) & 1) << 1 |
                             (ushort)(SUB161(auVar81 >> 0x17,0) & 1) << 2 |
                             (ushort)(SUB161(auVar81 >> 0x1f,0) & 1) << 3 |
                             (ushort)(SUB161(auVar81 >> 0x27,0) & 1) << 4 |
                             (ushort)(SUB161(auVar81 >> 0x2f,0) & 1) << 5 |
                             (ushort)(SUB161(auVar81 >> 0x37,0) & 1) << 6 |
                             (ushort)(SUB161(auVar81 >> 0x3f,0) & 1) << 7 |
                             (ushort)(SUB161(auVar81 >> 0x47,0) & 1) << 8 |
                             (ushort)(SUB161(auVar81 >> 0x4f,0) & 1) << 9 |
                             (ushort)(SUB161(auVar81 >> 0x57,0) & 1) << 10 |
                             (ushort)(SUB161(auVar81 >> 0x5f,0) & 1) << 0xb |
                             (ushort)(SUB161(auVar81 >> 0x67,0) & 1) << 0xc |
                             (ushort)(SUB161(auVar81 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar81 >> 0x77,0) & 1) << 0xe |
                            (ushort)(byte)(auVar81[0xf] >> 7) << 0xf) == 0xffff)) ||
                   (auVar51[0] = -(local_3fc == 'S'), auVar51[1] = -(cStack_3fb == 'Y'),
                   auVar51[2] = -(cStack_3fa == 'S'), auVar51[3] = -(cStack_3f9 == ' '),
                   auVar51[4] = -(cStack_3f8 == '/'), auVar51[5] = -(cStack_3f7 == ' '),
                   auVar51[6] = -(cStack_3f6 == 'S'), auVar51[7] = -(cStack_3f5 == 'C'),
                   auVar51[8] = -(cStack_3f4 == 'A'), auVar51[9] = -(cStack_3f3 == 'L'),
                   auVar51[10] = -(cStack_3f2 == 'E'), auVar51[0xb] = -(cStack_3f1 == ' '),
                   auVar51[0xc] = -(cStack_3f0 == 'F'), auVar51[0xd] = -(cStack_3ef == 'A'),
                   auVar51[0xe] = -(cStack_3ee == 'C'), auVar51[0xf] = -(cStack_3ed == 'T'),
                   auVar82[0] = -(local_3ec == 'O'), auVar82[1] = -(cStack_3eb == 'R'),
                   auVar82[2] = 0xff, auVar82[3] = 0xff, auVar82[4] = 0xff, auVar82[5] = 0xff,
                   auVar82[6] = 0xff, auVar82[7] = 0xff, auVar82[8] = 0xff, auVar82[9] = 0xff,
                   auVar82[10] = 0xff, auVar82[0xb] = 0xff, auVar82[0xc] = 0xff, auVar82[0xd] = 0xff
                   , auVar82[0xe] = 0xff, auVar82[0xf] = 0xff, auVar82 = auVar82 & auVar51,
                   (ushort)((ushort)(SUB161(auVar82 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar82 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar82 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar82 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar82 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar82 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar82 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar82 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar82 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar82 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar82 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar82 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar82 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar82 >> 0x6f,0) & 1) << 0xd |
                            (ushort)(SUB161(auVar82 >> 0x77,0) & 1) << 0xe |
                           (ushort)(byte)(auVar82[0xf] >> 7) << 0xf) == 0xffff)) goto LAB_001269d0;
                if (CONCAT13(cStack_3f1,CONCAT12(cStack_3f2,CONCAT11(cStack_3f3,cStack_3f4))) ==
                    0x53444e4f &&
                    CONCAT17(cStack_3f5,
                             CONCAT16(cStack_3f6,
                                      CONCAT15(cStack_3f7,
                                               CONCAT14(cStack_3f8,
                                                        CONCAT13(cStack_3f9,
                                                                 CONCAT12(cStack_3fa,
                                                                          CONCAT11(cStack_3fb,
                                                                                   local_3fc)))))))
                    == 0x434553205041454c) {
                  uStack_5f0 = 0x126f97;
                  local_5e8 = cVar6;
                  cStack_5e7 = cVar7;
                  cStack_5e6 = cVar8;
                  cStack_5e5 = cVar9;
                  uStack_5e2 = uVar10;
                  uStack_5e1 = uVar11;
                  uStack_5e0 = uVar12;
                  cStack_5d9 = cVar13;
                  uStack_5d0 = uVar14;
                  uStack_5c8 = uVar15;
                  uStack_5c0 = uVar16;
                  uStack_5bf = uVar17;
                  lVar20 = coda_ascii_parse_int64(local_438,6,(int64_t *)local_598,0);
                  lVar30 = local_4a0;
                  if (lVar20 < 0) goto LAB_00127fd0;
                  uStack_5f0 = 0x126fc0;
                  pcVar21 = coda_mem_int32_new(*(coda_type_number **)
                                                (*(long *)(in_FS_OFFSET + -0x118) + 0x148),
                                               (coda_dynamic_type *)0x0,
                                               (coda_product *)local_590._8_8_,local_598[0]);
                  pcVar29 = "leap_seconds";
                }
                else {
                  if (CONCAT17(cStack_3ee,
                               CONCAT16(cStack_3ef,
                                        CONCAT15(cStack_3f0,
                                                 CONCAT14(cStack_3f1,
                                                          CONCAT13(cStack_3f2,
                                                                   CONCAT12(cStack_3f3,
                                                                            CONCAT11(cStack_3f4,
                                                                                     cStack_3f5)))))
                                       )) != 0x534554494c4c4554 ||
                      CONCAT17(cStack_3f5,
                               CONCAT16(cStack_3f6,
                                        CONCAT15(cStack_3f7,
                                                 CONCAT14(cStack_3f8,
                                                          CONCAT13(cStack_3f9,
                                                                   CONCAT12(cStack_3fa,
                                                                            CONCAT11(cStack_3fb,
                                                                                     local_3fc))))))
                              ) != 0x54415320464f2023) {
                    if (CONCAT17(cStack_3ef,
                                 CONCAT16(cStack_3f0,
                                          CONCAT15(cStack_3f1,
                                                   CONCAT14(cStack_3f2,
                                                            CONCAT13(cStack_3f3,
                                                                     CONCAT12(cStack_3f4,
                                                                              CONCAT11(cStack_3f5,
                                                                                       cStack_3f6)))
                                                           )))) == 0x53424f20464f2023 &&
                        CONCAT17(cStack_3f5,
                                 CONCAT16(cStack_3f6,
                                          CONCAT15(cStack_3f7,
                                                   CONCAT14(cStack_3f8,
                                                            CONCAT13(cStack_3f9,
                                                                     CONCAT12(cStack_3fa,
                                                                              CONCAT11(cStack_3fb,
                                                                                       local_3fc))))
                                                  ))) == 0x2023202f204e5250) goto LAB_001269d0;
                    local_5e8 = cVar6;
                    cStack_5e7 = cVar7;
                    cStack_5e6 = cVar8;
                    cStack_5e5 = cVar9;
                    uStack_5e2 = uVar10;
                    uStack_5e1 = uVar11;
                    uStack_5e0 = uVar12;
                    cStack_5d9 = cVar13;
                    uStack_5d0 = uVar14;
                    uStack_5c8 = uVar15;
                    uStack_5c0 = uVar16;
                    uStack_5bf = uVar17;
                    if (CONCAT17(cStack_3f0,
                                 CONCAT16(cStack_3f1,
                                          CONCAT15(cStack_3f2,
                                                   CONCAT14(cStack_3f3,
                                                            CONCAT13(cStack_3f4,
                                                                     CONCAT12(cStack_3f5,
                                                                              CONCAT11(cStack_3f6,
                                                                                       cStack_3f7)))
                                                           )))) == 0x5245444145482046 &&
                        CONCAT17(cStack_3f5,
                                 CONCAT16(cStack_3f6,
                                          CONCAT15(cStack_3f7,
                                                   CONCAT14(cStack_3f8,
                                                            CONCAT13(cStack_3f9,
                                                                     CONCAT12(cStack_3fa,
                                                                              CONCAT11(cStack_3fb,
                                                                                       local_3fc))))
                                                  ))) == 0x4820464f20444e45) goto LAB_0012840c;
LAB_0012830a:
                    pcVar29 = &local_3fc;
                    message = "invalid header item \'%s\' (line: %ld, byte offset: %ld)";
                    lVar30 = local_4a0 + 0x3c;
                    goto LAB_00125a82;
                  }
                  uStack_5f0 = 0x126fe2;
                  local_5e8 = cVar6;
                  cStack_5e7 = cVar7;
                  cStack_5e6 = cVar8;
                  cStack_5e5 = cVar9;
                  uStack_5e2 = uVar10;
                  uStack_5e1 = uVar11;
                  uStack_5e0 = uVar12;
                  cStack_5d9 = cVar13;
                  uStack_5d0 = uVar14;
                  uStack_5c8 = uVar15;
                  uStack_5c0 = uVar16;
                  uStack_5bf = uVar17;
                  lVar20 = coda_ascii_parse_int64(local_438,6,(int64_t *)local_598,0);
                  lVar30 = local_4a0;
                  if (lVar20 < 0) goto LAB_00127fd0;
                  uStack_5f0 = 0x12700c;
                  pcVar21 = coda_mem_uint16_new(*(coda_type_number **)
                                                 (*(long *)(in_FS_OFFSET + -0x118) + 0x150),
                                                (coda_dynamic_type *)0x0,
                                                (coda_product *)local_590._8_8_,
                                                (uint16_t)local_598[0]);
                  pcVar29 = "num_satellites";
                }
              }
            }
          }
        }
        uStack_5f0 = 0x126f74;
        coda_mem_record_add_field
                  ((coda_mem_record *)local_590._16_8_,pcVar29,(coda_dynamic_type *)pcVar21,0);
        cVar6 = local_5e8;
        cVar7 = cStack_5e7;
        cVar8 = cStack_5e6;
        cVar9 = cStack_5e5;
        uVar10 = uStack_5e2;
        uVar11 = uStack_5e1;
        uVar12 = uStack_5e0;
        cVar13 = cStack_5d9;
        uVar14 = uStack_5d0;
        uVar15 = uStack_5c8;
        uVar16 = uStack_5c0;
        uVar17 = uStack_5bf;
LAB_001269d0:
        uStack_5bf = uVar17;
        uStack_5c0 = uVar16;
        uStack_5c8 = uVar15;
        uStack_5d0 = uVar14;
        cStack_5d9 = cVar13;
        uStack_5e0 = uVar12;
        uStack_5e1 = uVar11;
        uStack_5e2 = uVar10;
        cStack_5e5 = cVar9;
        cStack_5e6 = cVar8;
        cStack_5e7 = cVar7;
        local_5e8 = cVar6;
        uStack_5f0 = 0x1269da;
        local_4a0 = ftell((FILE *)local_590._0_8_);
        local_4a8 = local_4a8 + 1;
        uStack_5f0 = 0x1269f7;
        uVar18 = get_line((FILE *)local_590._0_8_,local_438);
        if ((int)uVar18 < 0) goto LAB_00125a89;
        goto LAB_00125e0e;
      }
      pcVar29 = "RINEX format version %3.2f is not supported for Clock data";
    }
    else if (uVar18 == 0x4e) {
      if ((dStack_4b8 == 3.0) && (!NAN(dStack_4b8))) {
        lVar30 = 0x3f8;
        goto LAB_00125b92;
      }
      pcVar29 = "RINEX format version %3.2f is not supported for Navigation data";
    }
    else {
      if (uVar18 != 0x4f) {
        uStack_5f0 = 0x125b81;
        coda_set_error(-200,"RINEX file type \'%c\' is not supported",
                       (ulong)(uint)(int)(char)uStack_424);
        goto LAB_00125a89;
      }
      if ((dStack_4b8 == 3.0) && (!NAN(dStack_4b8))) {
        lVar30 = 0x1a8;
        goto LAB_00125b92;
      }
      pcVar29 = "RINEX format version %3.2f is not supported for Observation data";
    }
    uStack_5f0 = 0x125b66;
    coda_set_error(-200,pcVar29);
    goto LAB_00125a89;
  }
  pcVar29 = &local_3fc;
  lVar30 = local_4a0 + 0x3c;
  message = "invalid header item \'%s\' (line: %ld, byte offset: %ld)";
LAB_00125a82:
  uStack_5f0 = 0x125a89;
  coda_set_error(-0x16,message,pcVar29,local_4a8,lVar30);
LAB_00125a89:
  uStack_5f0 = 0x125a93;
  ingest_info_cleanup((ingest_info *)local_590);
  return -1;
LAB_00127fa9:
  pcVar29 = (char *)(ulong)uVar18;
LAB_001259f8:
  message = "header line length (%ld) too short (line: %ld, byte offset: %ld)";
  lVar30 = local_4a0;
  goto LAB_00125a82;
}

Assistant:

static int read_file(coda_product *product)
{
    coda_mem_record *root_type = NULL;
    ingest_info info;

    ingest_info_init(&info);
    info.product = product;

    info.f = fopen(product->filename, "r");
    if (info.f == NULL)
    {
        coda_set_error(CODA_ERROR_FILE_OPEN, "could not open file %s", product->filename);
        return -1;
    }

    info.header = coda_mem_record_new((coda_type_record *)sp3_type[sp3_header], NULL);
    info.records = coda_mem_array_new((coda_type_array *)sp3_type[sp3_records], NULL);

    if (read_header(&info) != 0)
    {
        ingest_info_cleanup(&info);
        return -1;
    }

    if (read_records(&info) != 0)
    {
        ingest_info_cleanup(&info);
        return -1;
    }

    /* create root record */
    root_type = coda_mem_record_new((coda_type_record *)sp3_type[sp3_file], NULL);
    coda_mem_record_add_field(root_type, "header", (coda_dynamic_type *)info.header, 0);
    info.header = NULL;
    coda_mem_record_add_field(root_type, "record", (coda_dynamic_type *)info.records, 0);
    info.records = NULL;

    product->root_type = (coda_dynamic_type *)root_type;

    ingest_info_cleanup(&info);

    return 0;
}